

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  undefined1 (*pauVar26) [32];
  int iVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar43 [32];
  undefined1 auVar34 [16];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar28;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar42 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [60];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar75 [16];
  undefined1 auVar101 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 in_ZMM1 [64];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar127 [16];
  undefined1 auVar141 [32];
  float fVar148;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 in_ZMM2 [64];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar198;
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar200;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar216 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar392 [64];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [64];
  undefined1 auVar396 [64];
  undefined1 auVar45 [32];
  undefined1 auVar56 [32];
  undefined1 auVar109 [32];
  undefined1 auVar134 [32];
  undefined1 auVar137 [32];
  
  auVar164 = in_ZMM1._0_16_;
  auVar127 = in_ZMM7._0_16_;
  switch((this->super_UnaryOp).op_type) {
  case 0:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    auVar43._8_4_ = 0x7fffffff;
    auVar43._0_8_ = 0x7fffffff7fffffff;
    auVar43._12_4_ = 0x7fffffff;
    auVar43._16_4_ = 0x7fffffff;
    auVar43._20_4_ = 0x7fffffff;
    auVar43._24_4_ = 0x7fffffff;
    auVar43._28_4_ = 0x7fffffff;
    auVar63._8_4_ = 0x7fffffff;
    auVar63._0_8_ = 0x7fffffff7fffffff;
    auVar63._12_4_ = 0x7fffffff;
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = vandps_avx(auVar43,*pauVar26);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar164 = vandps_avx(auVar63,*(undefined1 (*) [16])*pauVar26);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar164 = vandps_avx(ZEXT416(*(uint *)((long)pvVar1 + lVar23 * 4 + lVar24)),auVar63);
        *(int *)((long)pvVar1 + lVar23 * 4 + lVar24) = auVar164._0_4_;
      }
    }
    break;
  case 1:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = *pauVar26;
        auVar140._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
        auVar140._8_4_ = auVar104._8_4_ ^ 0x80000000;
        auVar140._12_4_ = auVar104._12_4_ ^ 0x80000000;
        auVar140._16_4_ = auVar104._16_4_ ^ 0x80000000;
        auVar140._20_4_ = auVar104._20_4_ ^ 0x80000000;
        auVar140._24_4_ = auVar104._24_4_ ^ 0x80000000;
        auVar140._28_4_ = auVar104._28_4_ ^ 0x80000000;
        *pauVar26 = auVar140;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar164 = *(undefined1 (*) [16])*pauVar26;
        auVar126._0_8_ = auVar164._0_8_ ^ 0x8000000080000000;
        auVar126._8_4_ = auVar164._8_4_ ^ 0x80000000;
        auVar126._12_4_ = auVar164._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar26 = auVar126;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        *(uint *)((long)pvVar1 + lVar23 * 4 + lVar24) =
             *(uint *)((long)pvVar1 + lVar23 * 4 + lVar24) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = vroundps_avx(*pauVar26,1);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar127 = vroundps_avx(*(undefined1 (*) [16])*pauVar26,1);
        *(undefined1 (*) [16])*pauVar26 = auVar127;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar127 = vroundss_avx(auVar164,ZEXT416(*(uint *)((long)pvVar1 + lVar23 * 4 + lVar24)),9);
        *(int *)((long)pvVar1 + lVar23 * 4 + lVar24) = auVar127._0_4_;
      }
    }
    break;
  case 3:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = vroundps_avx(*pauVar26,2);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar127 = vroundps_avx(*(undefined1 (*) [16])*pauVar26,2);
        *(undefined1 (*) [16])*pauVar26 = auVar127;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar127 = vroundss_avx(auVar164,ZEXT416(*(uint *)((long)pvVar1 + lVar23 * 4 + lVar24)),10);
        *(int *)((long)pvVar1 + lVar23 * 4 + lVar24) = auVar127._0_4_;
      }
    }
    break;
  case 4:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar6._4_4_ = *(float *)(*pauVar26 + 4) * *(float *)(*pauVar26 + 4);
        auVar6._0_4_ = *(float *)*pauVar26 * *(float *)*pauVar26;
        auVar6._8_4_ = *(float *)(*pauVar26 + 8) * *(float *)(*pauVar26 + 8);
        auVar6._12_4_ = *(float *)(*pauVar26 + 0xc) * *(float *)(*pauVar26 + 0xc);
        auVar6._16_4_ = *(float *)(*pauVar26 + 0x10) * *(float *)(*pauVar26 + 0x10);
        auVar6._20_4_ = *(float *)(*pauVar26 + 0x14) * *(float *)(*pauVar26 + 0x14);
        auVar6._24_4_ = *(float *)(*pauVar26 + 0x18) * *(float *)(*pauVar26 + 0x18);
        auVar6._28_4_ = *(undefined4 *)(*pauVar26 + 0x1c);
        *pauVar26 = auVar6;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar35._0_4_ = *(float *)*pauVar26 * *(float *)*pauVar26;
        auVar35._4_4_ = *(float *)(*pauVar26 + 4) * *(float *)(*pauVar26 + 4);
        auVar35._8_4_ = *(float *)(*pauVar26 + 8) * *(float *)(*pauVar26 + 8);
        auVar35._12_4_ = *(float *)(*pauVar26 + 0xc) * *(float *)(*pauVar26 + 0xc);
        *(undefined1 (*) [16])*pauVar26 = auVar35;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        fVar28 = *(float *)((long)pvVar1 + lVar23 * 4 + lVar24);
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28 * fVar28;
      }
    }
    break;
  case 5:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = vsqrtps_avx(*pauVar26);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar127 = vsqrtps_avx(*(undefined1 (*) [16])*pauVar26);
        *(undefined1 (*) [16])*pauVar26 = auVar127;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar127 = vsqrtss_avx(auVar164,ZEXT416(*(uint *)((long)pvVar1 + lVar23 * 4 + lVar24)));
        *(int *)((long)pvVar1 + lVar23 * 4 + lVar24) = auVar127._0_4_;
      }
    }
    break;
  case 6:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = vrsqrtps_avx(*pauVar26);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar164 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar26);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar164 = vsqrtss_avx(in_ZMM2._0_16_,ZEXT416(*(uint *)((long)pvVar1 + lVar23 * 4 + lVar24))
                              );
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = 1.0 / auVar164._0_4_;
      }
    }
    break;
  case 7:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    auVar392 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; auVar164 = auVar392._0_16_, iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar55._8_4_ = 0x42b0c0a5;
        auVar55._0_8_ = 0x42b0c0a542b0c0a5;
        auVar55._12_4_ = 0x42b0c0a5;
        auVar55._16_4_ = 0x42b0c0a5;
        auVar55._20_4_ = 0x42b0c0a5;
        auVar55._24_4_ = 0x42b0c0a5;
        auVar55._28_4_ = 0x42b0c0a5;
        auVar104 = vminps_avx(auVar55,*pauVar26);
        auVar102._8_4_ = 0xc2b0c0a5;
        auVar102._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar102._12_4_ = 0xc2b0c0a5;
        auVar102._16_4_ = 0xc2b0c0a5;
        auVar102._20_4_ = 0xc2b0c0a5;
        auVar102._24_4_ = 0xc2b0c0a5;
        auVar102._28_4_ = 0xc2b0c0a5;
        auVar44 = vmaxps_avx(auVar104,auVar102);
        auVar103._8_4_ = 0x3fb8aa3b;
        auVar103._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar103._12_4_ = 0x3fb8aa3b;
        auVar103._16_4_ = 0x3fb8aa3b;
        auVar103._20_4_ = 0x3fb8aa3b;
        auVar103._24_4_ = 0x3fb8aa3b;
        auVar103._28_4_ = 0x3fb8aa3b;
        auVar230._8_4_ = 0x3f000000;
        auVar230._0_8_ = 0x3f0000003f000000;
        auVar230._12_4_ = 0x3f000000;
        auVar230._16_4_ = 0x3f000000;
        auVar230._20_4_ = 0x3f000000;
        auVar230._24_4_ = 0x3f000000;
        auVar230._28_4_ = 0x3f000000;
        auVar127 = vfmadd213ps_fma(auVar103,auVar44,auVar230);
        auVar141 = vroundps_avx(ZEXT1632(auVar127),1);
        auVar104 = vcmpps_avx(ZEXT1632(auVar127),auVar141,1);
        auVar190._8_4_ = 0x3f800000;
        auVar190._0_8_ = 0x3f8000003f800000;
        auVar190._12_4_ = 0x3f800000;
        auVar190._16_4_ = 0x3f800000;
        auVar190._20_4_ = 0x3f800000;
        auVar190._24_4_ = 0x3f800000;
        auVar190._28_4_ = 0x3f800000;
        auVar104 = vandps_avx(auVar104,auVar190);
        auVar104 = vsubps_avx(auVar141,auVar104);
        auVar138._8_4_ = 0x3f318000;
        auVar138._0_8_ = 0x3f3180003f318000;
        auVar138._12_4_ = 0x3f318000;
        auVar138._16_4_ = 0x3f318000;
        auVar138._20_4_ = 0x3f318000;
        auVar138._24_4_ = 0x3f318000;
        auVar138._28_4_ = 0x3f318000;
        auVar127 = vfmsub231ps_fma(auVar44,auVar104,auVar138);
        auVar139._8_4_ = 0x395e8083;
        auVar139._0_8_ = 0x395e8083395e8083;
        auVar139._12_4_ = 0x395e8083;
        auVar139._16_4_ = 0x395e8083;
        auVar139._20_4_ = 0x395e8083;
        auVar139._24_4_ = 0x395e8083;
        auVar139._28_4_ = 0x395e8083;
        auVar118 = vfmsub231ps_fma(ZEXT1632(auVar127),auVar104,auVar139);
        auVar44 = ZEXT1632(auVar118);
        auVar12._28_4_ = 0x395e8083;
        auVar12._0_28_ =
             ZEXT1628(CONCAT412(auVar118._12_4_ * auVar118._12_4_,
                                CONCAT48(auVar118._8_4_ * auVar118._8_4_,
                                         CONCAT44(auVar118._4_4_ * auVar118._4_4_,
                                                  auVar118._0_4_ * auVar118._0_4_))));
        auVar191._8_4_ = 0x39506967;
        auVar191._0_8_ = 0x3950696739506967;
        auVar191._12_4_ = 0x39506967;
        auVar191._16_4_ = 0x39506967;
        auVar191._20_4_ = 0x39506967;
        auVar191._24_4_ = 0x39506967;
        auVar191._28_4_ = 0x39506967;
        auVar290._8_4_ = 0x3ab743ce;
        auVar290._0_8_ = 0x3ab743ce3ab743ce;
        auVar290._12_4_ = 0x3ab743ce;
        auVar290._16_4_ = 0x3ab743ce;
        auVar290._20_4_ = 0x3ab743ce;
        auVar290._24_4_ = 0x3ab743ce;
        auVar290._28_4_ = 0x3ab743ce;
        auVar127 = vfmadd213ps_fma(auVar191,auVar44,auVar290);
        auVar291._8_4_ = 0x3c088908;
        auVar291._0_8_ = 0x3c0889083c088908;
        auVar291._12_4_ = 0x3c088908;
        auVar291._16_4_ = 0x3c088908;
        auVar291._20_4_ = 0x3c088908;
        auVar291._24_4_ = 0x3c088908;
        auVar291._28_4_ = 0x3c088908;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar291);
        auVar292._8_4_ = 0x3d2aa9c1;
        auVar292._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar292._12_4_ = 0x3d2aa9c1;
        auVar292._16_4_ = 0x3d2aa9c1;
        auVar292._20_4_ = 0x3d2aa9c1;
        auVar292._24_4_ = 0x3d2aa9c1;
        auVar292._28_4_ = 0x3d2aa9c1;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar292);
        auVar293._8_4_ = 0x3e2aaaaa;
        auVar293._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar293._12_4_ = 0x3e2aaaaa;
        auVar293._16_4_ = 0x3e2aaaaa;
        auVar293._20_4_ = 0x3e2aaaaa;
        auVar293._24_4_ = 0x3e2aaaaa;
        auVar293._28_4_ = 0x3e2aaaaa;
        auVar44 = ZEXT1632(auVar118);
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar293);
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar230);
        auVar118 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar12,auVar44);
        auVar37._0_4_ = (int)auVar104._0_4_;
        auVar37._4_4_ = (int)auVar104._4_4_;
        auVar37._8_4_ = (int)auVar104._8_4_;
        auVar37._12_4_ = (int)auVar104._12_4_;
        auVar56._16_4_ = (int)auVar104._16_4_;
        auVar56._0_16_ = auVar37;
        auVar56._20_4_ = (int)auVar104._20_4_;
        auVar56._24_4_ = (int)auVar104._24_4_;
        auVar56._28_4_ = (int)auVar104._28_4_;
        auVar64 = vpslld_avx(auVar37,0x17);
        auVar127 = vpslld_avx(auVar56._16_16_,0x17);
        auVar127 = vpaddd_avx(auVar127,auVar164);
        auVar164 = vpaddd_avx(auVar64,auVar164);
        auVar57._16_16_ = auVar127;
        auVar57._0_16_ = auVar164;
        auVar164 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar118),auVar57);
        *pauVar26 = ZEXT1632(auVar164);
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar38._8_4_ = 0x42b0c0a5;
        auVar38._0_8_ = 0x42b0c0a542b0c0a5;
        auVar38._12_4_ = 0x42b0c0a5;
        auVar127 = vminps_avx(auVar38,*(undefined1 (*) [16])*pauVar26);
        auVar80._8_4_ = 0xc2b0c0a5;
        auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar80._12_4_ = 0xc2b0c0a5;
        auVar64 = vmaxps_avx(auVar127,auVar80);
        auVar81._8_4_ = 0x3fb8aa3b;
        auVar81._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar81._12_4_ = 0x3fb8aa3b;
        auVar216._8_4_ = 0x3f000000;
        auVar216._0_8_ = 0x3f0000003f000000;
        auVar216._12_4_ = 0x3f000000;
        auVar127 = vfmadd213ps_fma(auVar81,auVar64,auVar216);
        auVar122._0_4_ = (int)auVar127._0_4_;
        auVar122._4_4_ = (int)auVar127._4_4_;
        auVar122._8_4_ = (int)auVar127._8_4_;
        auVar122._12_4_ = (int)auVar127._12_4_;
        auVar118 = vcvtdq2ps_avx(auVar122);
        auVar127 = vcmpps_avx(auVar127,auVar118,1);
        auVar127 = vandps_avx(auVar127,auVar164);
        auVar127 = vsubps_avx(auVar118,auVar127);
        auVar123._8_4_ = 0x3f318000;
        auVar123._0_8_ = 0x3f3180003f318000;
        auVar123._12_4_ = 0x3f318000;
        auVar118 = vfmsub231ps_fma(auVar64,auVar127,auVar123);
        auVar124._8_4_ = 0x395e8083;
        auVar124._0_8_ = 0x395e8083395e8083;
        auVar124._12_4_ = 0x395e8083;
        auVar64 = vfmsub231ps_fma(auVar118,auVar127,auVar124);
        auVar125._0_4_ = auVar64._0_4_ * auVar64._0_4_;
        auVar125._4_4_ = auVar64._4_4_ * auVar64._4_4_;
        auVar125._8_4_ = auVar64._8_4_ * auVar64._8_4_;
        auVar125._12_4_ = auVar64._12_4_ * auVar64._12_4_;
        auVar163._8_4_ = 0x39506967;
        auVar163._0_8_ = 0x3950696739506967;
        auVar163._12_4_ = 0x39506967;
        auVar257._8_4_ = 0x3ab743ce;
        auVar257._0_8_ = 0x3ab743ce3ab743ce;
        auVar257._12_4_ = 0x3ab743ce;
        auVar118 = vfmadd213ps_fma(auVar163,auVar64,auVar257);
        auVar258._8_4_ = 0x3c088908;
        auVar258._0_8_ = 0x3c0889083c088908;
        auVar258._12_4_ = 0x3c088908;
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar258);
        auVar259._8_4_ = 0x3d2aa9c1;
        auVar259._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar259._12_4_ = 0x3d2aa9c1;
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar259);
        auVar260._8_4_ = 0x3e2aaaaa;
        auVar260._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar260._12_4_ = 0x3e2aaaaa;
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar260);
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar216);
        auVar118 = vfmadd213ps_fma(auVar118,auVar125,auVar64);
        auVar39._0_4_ = (int)auVar127._0_4_;
        auVar39._4_4_ = (int)auVar127._4_4_;
        auVar39._8_4_ = (int)auVar127._8_4_;
        auVar39._12_4_ = (int)auVar127._12_4_;
        auVar127 = vpslld_avx(auVar39,0x17);
        auVar127 = vpaddd_avx(auVar127,auVar164);
        auVar127 = vfmadd213ps_fma(auVar127,auVar118,auVar127);
        *(undefined1 (*) [16])*pauVar26 = auVar127;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        fVar28 = expf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        auVar392 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 8:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar110._8_4_ = 0x800000;
        auVar110._0_8_ = 0x80000000800000;
        auVar110._12_4_ = 0x800000;
        auVar110._16_4_ = 0x800000;
        auVar110._20_4_ = 0x800000;
        auVar110._24_4_ = 0x800000;
        auVar110._28_4_ = 0x800000;
        auVar104 = vmaxps_avx(*pauVar26,auVar110);
        auVar127 = vpsrld_avx(auVar104._0_16_,0x17);
        auVar164 = vpsrld_avx(auVar104._16_16_,0x17);
        auVar235._8_4_ = 0x807fffff;
        auVar235._0_8_ = 0x807fffff807fffff;
        auVar235._12_4_ = 0x807fffff;
        auVar235._16_4_ = 0x807fffff;
        auVar235._20_4_ = 0x807fffff;
        auVar235._24_4_ = 0x807fffff;
        auVar235._28_4_ = 0x807fffff;
        auVar104 = vandps_avx(auVar104,auVar235);
        auVar361._8_4_ = 0x3f000000;
        auVar361._0_8_ = 0x3f0000003f000000;
        auVar361._12_4_ = 0x3f000000;
        auVar361._16_4_ = 0x3f000000;
        auVar361._20_4_ = 0x3f000000;
        auVar361._24_4_ = 0x3f000000;
        auVar361._28_4_ = 0x3f000000;
        auVar141 = vorps_avx(auVar104,auVar361);
        auVar236._8_4_ = 0x3f3504f3;
        auVar236._0_8_ = 0x3f3504f33f3504f3;
        auVar236._12_4_ = 0x3f3504f3;
        auVar236._16_4_ = 0x3f3504f3;
        auVar236._20_4_ = 0x3f3504f3;
        auVar236._24_4_ = 0x3f3504f3;
        auVar236._28_4_ = 0x3f3504f3;
        auVar44 = vcmpps_avx(auVar236,auVar141,2);
        auVar104 = vandnps_avx(auVar44,auVar141);
        auVar111._0_4_ = auVar141._0_4_ + -1.0 + auVar104._0_4_;
        auVar111._4_4_ = auVar141._4_4_ + -1.0 + auVar104._4_4_;
        auVar111._8_4_ = auVar141._8_4_ + -1.0 + auVar104._8_4_;
        auVar111._12_4_ = auVar141._12_4_ + -1.0 + auVar104._12_4_;
        auVar111._16_4_ = auVar141._16_4_ + -1.0 + auVar104._16_4_;
        auVar111._20_4_ = auVar141._20_4_ + -1.0 + auVar104._20_4_;
        auVar111._24_4_ = auVar141._24_4_ + -1.0 + auVar104._24_4_;
        auVar111._28_4_ = auVar141._28_4_ + -1.0 + auVar104._28_4_;
        auVar164 = vpsubd_avx(auVar164,auVar44._16_16_);
        auVar273._8_4_ = 0xffffff81;
        auVar273._0_8_ = 0xffffff81ffffff81;
        auVar273._12_4_ = 0xffffff81;
        auVar164 = vpaddd_avx(auVar164,auVar273);
        auVar127 = vpsubd_avx(auVar127,auVar44._0_16_);
        auVar127 = vpaddd_avx(auVar127,auVar273);
        auVar145._16_16_ = auVar164;
        auVar145._0_16_ = auVar127;
        auVar196._0_4_ = auVar111._0_4_ * auVar111._0_4_;
        auVar196._4_4_ = auVar111._4_4_ * auVar111._4_4_;
        auVar196._8_4_ = auVar111._8_4_ * auVar111._8_4_;
        auVar196._12_4_ = auVar111._12_4_ * auVar111._12_4_;
        auVar196._16_4_ = auVar111._16_4_ * auVar111._16_4_;
        auVar196._20_4_ = auVar111._20_4_ * auVar111._20_4_;
        auVar196._24_4_ = auVar111._24_4_ * auVar111._24_4_;
        auVar196._28_4_ = 0;
        auVar237._8_4_ = 0x3d9021bb;
        auVar237._0_8_ = 0x3d9021bb3d9021bb;
        auVar237._12_4_ = 0x3d9021bb;
        auVar237._16_4_ = 0x3d9021bb;
        auVar237._20_4_ = 0x3d9021bb;
        auVar237._24_4_ = 0x3d9021bb;
        auVar237._28_4_ = 0x3d9021bb;
        auVar311._8_4_ = 0xbdebd1b8;
        auVar311._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar311._12_4_ = 0xbdebd1b8;
        auVar311._16_4_ = 0xbdebd1b8;
        auVar311._20_4_ = 0xbdebd1b8;
        auVar311._24_4_ = 0xbdebd1b8;
        auVar311._28_4_ = 0xbdebd1b8;
        auVar164 = vfmadd213ps_fma(auVar237,auVar111,auVar311);
        auVar312._8_4_ = 0x3def251a;
        auVar312._0_8_ = 0x3def251a3def251a;
        auVar312._12_4_ = 0x3def251a;
        auVar312._16_4_ = 0x3def251a;
        auVar312._20_4_ = 0x3def251a;
        auVar312._24_4_ = 0x3def251a;
        auVar312._28_4_ = 0x3def251a;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar111,auVar312);
        auVar313._8_4_ = 0xbdfe5d4f;
        auVar313._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar313._12_4_ = 0xbdfe5d4f;
        auVar313._16_4_ = 0xbdfe5d4f;
        auVar313._20_4_ = 0xbdfe5d4f;
        auVar313._24_4_ = 0xbdfe5d4f;
        auVar313._28_4_ = 0xbdfe5d4f;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar111,auVar313);
        auVar314._8_4_ = 0x3e11e9bf;
        auVar314._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar314._12_4_ = 0x3e11e9bf;
        auVar314._16_4_ = 0x3e11e9bf;
        auVar314._20_4_ = 0x3e11e9bf;
        auVar314._24_4_ = 0x3e11e9bf;
        auVar314._28_4_ = 0x3e11e9bf;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar111,auVar314);
        auVar315._8_4_ = 0xbe2aae50;
        auVar315._0_8_ = 0xbe2aae50be2aae50;
        auVar315._12_4_ = 0xbe2aae50;
        auVar315._16_4_ = 0xbe2aae50;
        auVar315._20_4_ = 0xbe2aae50;
        auVar315._24_4_ = 0xbe2aae50;
        auVar315._28_4_ = 0xbe2aae50;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar111,auVar315);
        auVar316._8_4_ = 0x3e4cceac;
        auVar316._0_8_ = 0x3e4cceac3e4cceac;
        auVar316._12_4_ = 0x3e4cceac;
        auVar316._16_4_ = 0x3e4cceac;
        auVar316._20_4_ = 0x3e4cceac;
        auVar316._24_4_ = 0x3e4cceac;
        auVar316._28_4_ = 0x3e4cceac;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar111,auVar316);
        auVar317._8_4_ = 0xbe7ffffc;
        auVar317._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar317._12_4_ = 0xbe7ffffc;
        auVar317._16_4_ = 0xbe7ffffc;
        auVar317._20_4_ = 0xbe7ffffc;
        auVar317._24_4_ = 0xbe7ffffc;
        auVar317._28_4_ = 0xbe7ffffc;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar111,auVar317);
        auVar318._8_4_ = 0x3eaaaaaa;
        auVar318._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar318._12_4_ = 0x3eaaaaaa;
        auVar318._16_4_ = 0x3eaaaaaa;
        auVar318._20_4_ = 0x3eaaaaaa;
        auVar318._24_4_ = 0x3eaaaaaa;
        auVar318._28_4_ = 0x3eaaaaaa;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar111,auVar318);
        auVar238._0_4_ = auVar196._0_4_ * auVar111._0_4_ * auVar164._0_4_;
        auVar238._4_4_ = auVar196._4_4_ * auVar111._4_4_ * auVar164._4_4_;
        auVar238._8_4_ = auVar196._8_4_ * auVar111._8_4_ * auVar164._8_4_;
        auVar238._12_4_ = auVar196._12_4_ * auVar111._12_4_ * auVar164._12_4_;
        auVar238._16_4_ = auVar196._16_4_ * auVar111._16_4_ * 0.0;
        auVar238._20_4_ = auVar196._20_4_ * auVar111._20_4_ * 0.0;
        auVar238._24_4_ = auVar196._24_4_ * auVar111._24_4_ * 0.0;
        auVar238._28_4_ = 0;
        auVar104 = vcvtdq2ps_avx(auVar145);
        auVar319._8_4_ = 0xb95e8083;
        auVar319._0_8_ = 0xb95e8083b95e8083;
        auVar319._12_4_ = 0xb95e8083;
        auVar319._16_4_ = 0xb95e8083;
        auVar319._20_4_ = 0xb95e8083;
        auVar319._24_4_ = 0xb95e8083;
        auVar319._28_4_ = 0xb95e8083;
        auVar164 = vfmadd231ps_fma(auVar238,auVar104,auVar319);
        auVar164 = vfmsub231ps_fma(ZEXT1632(auVar164),auVar361,auVar196);
        auVar44 = vsubps_avx(ZEXT1632(auVar164),auVar111);
        auVar197._8_4_ = 0x3f318000;
        auVar197._0_8_ = 0x3f3180003f318000;
        auVar197._12_4_ = 0x3f318000;
        auVar197._16_4_ = 0x3f318000;
        auVar197._20_4_ = 0x3f318000;
        auVar197._24_4_ = 0x3f318000;
        auVar197._28_4_ = 0x3f318000;
        auVar164 = vfmsub231ps_fma(auVar44,auVar197,auVar104);
        auVar104 = vcmpps_avx(*pauVar26,_DAT_0053be40,2);
        auVar104 = vorps_avx(auVar104,ZEXT1632(auVar164));
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar88._8_4_ = 0x800000;
        auVar88._0_8_ = 0x80000000800000;
        auVar88._12_4_ = 0x800000;
        auVar164 = vmaxps_avx(*(undefined1 (*) [16])*pauVar26,auVar88);
        auVar127 = vpsrld_avx(auVar164,0x17);
        auVar179._8_4_ = 0xffffff82;
        auVar179._0_8_ = 0xffffff82ffffff82;
        auVar179._12_4_ = 0xffffff82;
        auVar127 = vpaddd_avx(auVar127,auVar179);
        auVar180._8_4_ = 0x807fffff;
        auVar180._0_8_ = 0x807fffff807fffff;
        auVar180._12_4_ = 0x807fffff;
        auVar164 = vandps_avx(auVar164,auVar180);
        auVar338._8_4_ = 0x3f000000;
        auVar338._0_8_ = 0x3f0000003f000000;
        auVar338._12_4_ = 0x3f000000;
        auVar64 = vorps_avx(auVar164,auVar338);
        auVar118 = vcvtdq2ps_avx(auVar127);
        auVar181._8_4_ = 0x3f3504f3;
        auVar181._0_8_ = 0x3f3504f33f3504f3;
        auVar181._12_4_ = 0x3f3504f3;
        auVar127 = vcmpps_avx(auVar64,auVar181,1);
        auVar164 = vandps_avx(auVar127,auVar64);
        auVar89._0_4_ = auVar64._0_4_ + -1.0 + auVar164._0_4_;
        auVar89._4_4_ = auVar64._4_4_ + -1.0 + auVar164._4_4_;
        auVar89._8_4_ = auVar64._8_4_ + -1.0 + auVar164._8_4_;
        auVar89._12_4_ = auVar64._12_4_ + -1.0 + auVar164._12_4_;
        auVar225._8_4_ = 0x3f800000;
        auVar225._0_8_ = 0x3f8000003f800000;
        auVar225._12_4_ = 0x3f800000;
        auVar164 = vandps_avx(auVar127,auVar225);
        auVar164 = vsubps_avx(auVar118,auVar164);
        auVar182._0_4_ = auVar89._0_4_ * auVar89._0_4_;
        auVar182._4_4_ = auVar89._4_4_ * auVar89._4_4_;
        auVar182._8_4_ = auVar89._8_4_ * auVar89._8_4_;
        auVar182._12_4_ = auVar89._12_4_ * auVar89._12_4_;
        auVar226._8_4_ = 0x3d9021bb;
        auVar226._0_8_ = 0x3d9021bb3d9021bb;
        auVar226._12_4_ = 0x3d9021bb;
        auVar274._8_4_ = 0xbdebd1b8;
        auVar274._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar274._12_4_ = 0xbdebd1b8;
        auVar127 = vfmadd213ps_fma(auVar226,auVar89,auVar274);
        auVar275._8_4_ = 0x3def251a;
        auVar275._0_8_ = 0x3def251a3def251a;
        auVar275._12_4_ = 0x3def251a;
        auVar127 = vfmadd213ps_fma(auVar127,auVar89,auVar275);
        auVar276._8_4_ = 0xbdfe5d4f;
        auVar276._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar276._12_4_ = 0xbdfe5d4f;
        auVar127 = vfmadd213ps_fma(auVar127,auVar89,auVar276);
        auVar277._8_4_ = 0x3e11e9bf;
        auVar277._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar277._12_4_ = 0x3e11e9bf;
        auVar127 = vfmadd213ps_fma(auVar127,auVar89,auVar277);
        auVar278._8_4_ = 0xbe2aae50;
        auVar278._0_8_ = 0xbe2aae50be2aae50;
        auVar278._12_4_ = 0xbe2aae50;
        auVar127 = vfmadd213ps_fma(auVar127,auVar89,auVar278);
        auVar279._8_4_ = 0x3e4cceac;
        auVar279._0_8_ = 0x3e4cceac3e4cceac;
        auVar279._12_4_ = 0x3e4cceac;
        auVar127 = vfmadd213ps_fma(auVar127,auVar89,auVar279);
        auVar280._8_4_ = 0xbe7ffffc;
        auVar280._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar280._12_4_ = 0xbe7ffffc;
        auVar127 = vfmadd213ps_fma(auVar127,auVar89,auVar280);
        auVar281._8_4_ = 0x3eaaaaaa;
        auVar281._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar281._12_4_ = 0x3eaaaaaa;
        auVar127 = vfmadd213ps_fma(auVar127,auVar89,auVar281);
        auVar227._0_4_ = auVar182._0_4_ * auVar89._0_4_ * auVar127._0_4_;
        auVar227._4_4_ = auVar182._4_4_ * auVar89._4_4_ * auVar127._4_4_;
        auVar227._8_4_ = auVar182._8_4_ * auVar89._8_4_ * auVar127._8_4_;
        auVar227._12_4_ = auVar182._12_4_ * auVar89._12_4_ * auVar127._12_4_;
        auVar282._8_4_ = 0xb95e8083;
        auVar282._0_8_ = 0xb95e8083b95e8083;
        auVar282._12_4_ = 0xb95e8083;
        auVar127 = vfmadd231ps_fma(auVar227,auVar164,auVar282);
        auVar127 = vfmsub231ps_fma(auVar127,auVar338,auVar182);
        auVar127 = vsubps_avx(auVar127,auVar89);
        auVar183._8_4_ = 0x3f318000;
        auVar183._0_8_ = 0x3f3180003f318000;
        auVar183._12_4_ = 0x3f318000;
        auVar127 = vfmsub231ps_fma(auVar127,auVar183,auVar164);
        auVar164 = vcmpps_avx(*(undefined1 (*) [16])*pauVar26,_DAT_00538060,2);
        auVar164 = vorps_avx(auVar164,auVar127);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        fVar28 = logf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 9:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    auVar164 = vpcmpeqd_avx(auVar127,auVar127);
    auVar392 = ZEXT1664(auVar164);
    auVar36._8_8_ = 0x8000000080000000;
    auVar36._0_8_ = 0x8000000080000000;
    auVar396 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      iVar27 = 0;
      while( true ) {
        auVar164 = auVar392._0_16_;
        auVar127 = auVar396._0_16_;
        if (iVar20 <= iVar27 + 7) break;
        auVar51._8_4_ = 0x7fffffff;
        auVar51._0_8_ = 0x7fffffff7fffffff;
        auVar51._12_4_ = 0x7fffffff;
        auVar51._16_4_ = 0x7fffffff;
        auVar51._20_4_ = 0x7fffffff;
        auVar51._24_4_ = 0x7fffffff;
        auVar51._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(*pauVar26,auVar51);
        auVar136._8_4_ = 0x80000000;
        auVar136._0_8_ = 0x8000000080000000;
        auVar136._12_4_ = 0x80000000;
        auVar136._16_4_ = 0x80000000;
        auVar136._20_4_ = 0x80000000;
        auVar136._24_4_ = 0x80000000;
        auVar136._28_4_ = 0x80000000;
        auVar44 = vandps_avx(*pauVar26,auVar136);
        auVar121._0_4_ = (int)(auVar104._0_4_ * 1.2732395);
        auVar121._4_4_ = (int)(auVar104._4_4_ * 1.2732395);
        auVar121._8_4_ = (int)(auVar104._8_4_ * 1.2732395);
        auVar121._12_4_ = (int)(auVar104._12_4_ * 1.2732395);
        auVar137._16_4_ = (int)(auVar104._16_4_ * 1.2732395);
        auVar137._0_16_ = auVar121;
        auVar137._20_4_ = (int)(auVar104._20_4_ * 1.2732395);
        auVar137._24_4_ = (int)(auVar104._24_4_ * 1.2732395);
        auVar137._28_4_ = 1;
        auVar64 = vpsubd_avx(auVar121,auVar164);
        auVar363 = vpsubd_avx(auVar137._16_16_,auVar164);
        auVar18._8_8_ = 0xfffffffefffffffe;
        auVar18._0_8_ = 0xfffffffefffffffe;
        auVar164 = vpand_avx(auVar64,auVar18);
        auVar118 = vpand_avx(auVar363,auVar18);
        auVar229._16_16_ = auVar118;
        auVar229._0_16_ = auVar164;
        auVar141 = vcvtdq2ps_avx(auVar229);
        auVar164 = vpslld_avx(auVar64,0x1d);
        auVar164 = vpand_avx(auVar36,auVar164);
        auVar118 = vpslld_avx(auVar363,0x1d);
        auVar118 = vpand_avx(auVar36,auVar118);
        auVar286._8_4_ = 0xbf490000;
        auVar286._0_8_ = 0xbf490000bf490000;
        auVar286._12_4_ = 0xbf490000;
        auVar286._16_4_ = 0xbf490000;
        auVar286._20_4_ = 0xbf490000;
        auVar286._24_4_ = 0xbf490000;
        auVar286._28_4_ = 0xbf490000;
        auVar165 = vfmadd231ps_fma(auVar104,auVar141,auVar286);
        auVar287._8_4_ = 0xb97da000;
        auVar287._0_8_ = 0xb97da000b97da000;
        auVar287._12_4_ = 0xb97da000;
        auVar287._16_4_ = 0xb97da000;
        auVar287._20_4_ = 0xb97da000;
        auVar287._24_4_ = 0xb97da000;
        auVar287._28_4_ = 0xb97da000;
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar141,auVar287);
        auVar288._8_4_ = 0xb3222169;
        auVar288._0_8_ = 0xb3222169b3222169;
        auVar288._12_4_ = 0xb3222169;
        auVar288._16_4_ = 0xb3222169;
        auVar288._20_4_ = 0xb3222169;
        auVar288._24_4_ = 0xb3222169;
        auVar288._28_4_ = 0xb3222169;
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar288,auVar141);
        fVar28 = auVar166._0_4_ * auVar166._0_4_;
        fVar198 = auVar166._4_4_ * auVar166._4_4_;
        fVar199 = auVar166._8_4_ * auVar166._8_4_;
        fVar200 = auVar166._12_4_ * auVar166._12_4_;
        auVar10._28_4_ = auVar141._28_4_;
        auVar10._0_28_ = ZEXT1628(CONCAT412(fVar200,CONCAT48(fVar199,CONCAT44(fVar198,fVar28))));
        auVar289._8_4_ = 0x37ccf5ce;
        auVar289._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar289._12_4_ = 0x37ccf5ce;
        auVar289._16_4_ = 0x37ccf5ce;
        auVar289._20_4_ = 0x37ccf5ce;
        auVar289._24_4_ = 0x37ccf5ce;
        auVar289._28_4_ = 0x37ccf5ce;
        auVar351._8_4_ = 0xbab6061a;
        auVar351._0_8_ = 0xbab6061abab6061a;
        auVar351._12_4_ = 0xbab6061a;
        auVar351._16_4_ = 0xbab6061a;
        auVar351._20_4_ = 0xbab6061a;
        auVar351._24_4_ = 0xbab6061a;
        auVar351._28_4_ = 0xbab6061a;
        auVar165 = vfmadd213ps_fma(auVar289,auVar10,auVar351);
        auVar352._8_4_ = 0x3d2aaaa5;
        auVar352._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar352._12_4_ = 0x3d2aaaa5;
        auVar352._16_4_ = 0x3d2aaaa5;
        auVar352._20_4_ = 0x3d2aaaa5;
        auVar352._24_4_ = 0x3d2aaaa5;
        auVar352._28_4_ = 0x3d2aaaa5;
        auVar165 = vfmadd213ps_fma(ZEXT1632(auVar165),auVar10,auVar352);
        auVar353._8_4_ = 0x3f000000;
        auVar353._0_8_ = 0x3f0000003f000000;
        auVar353._12_4_ = 0x3f000000;
        auVar353._16_4_ = 0x3f000000;
        auVar353._20_4_ = 0x3f000000;
        auVar353._24_4_ = 0x3f000000;
        auVar353._28_4_ = 0x3f000000;
        auVar167 = vfnmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * fVar200 * auVar165._12_4_,
                                                       CONCAT48(fVar199 * fVar199 * auVar165._8_4_,
                                                                CONCAT44(fVar198 * fVar198 *
                                                                         auVar165._4_4_,
                                                                         fVar28 * fVar28 *
                                                                         auVar165._0_4_)))),auVar10,
                                    auVar353);
        auVar354._8_4_ = 0xb94ca1f9;
        auVar354._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar354._12_4_ = 0xb94ca1f9;
        auVar354._16_4_ = 0xb94ca1f9;
        auVar354._20_4_ = 0xb94ca1f9;
        auVar354._24_4_ = 0xb94ca1f9;
        auVar354._28_4_ = 0xb94ca1f9;
        auVar390._8_4_ = 0x3c08839e;
        auVar390._0_8_ = 0x3c08839e3c08839e;
        auVar390._12_4_ = 0x3c08839e;
        auVar390._16_4_ = 0x3c08839e;
        auVar390._20_4_ = 0x3c08839e;
        auVar390._24_4_ = 0x3c08839e;
        auVar390._28_4_ = 0x3c08839e;
        auVar165 = vfmadd213ps_fma(auVar354,auVar10,auVar390);
        auVar391._8_4_ = 0xbe2aaaa3;
        auVar391._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar391._12_4_ = 0xbe2aaaa3;
        auVar391._16_4_ = 0xbe2aaaa3;
        auVar391._20_4_ = 0xbe2aaaa3;
        auVar391._24_4_ = 0xbe2aaaa3;
        auVar391._28_4_ = 0xbe2aaaa3;
        auVar165 = vfmadd213ps_fma(ZEXT1632(auVar165),auVar10,auVar391);
        auVar11._28_4_ = auVar141._28_4_;
        auVar11._0_28_ =
             ZEXT1628(CONCAT412(auVar165._12_4_ * fVar200,
                                CONCAT48(auVar165._8_4_ * fVar199,
                                         CONCAT44(auVar165._4_4_ * fVar198,auVar165._0_4_ * fVar28))
                               ));
        auVar165 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar166),ZEXT1632(auVar166));
        auVar64 = vpand_avx(auVar127,auVar64);
        auVar127 = vpand_avx(auVar127,auVar363);
        auVar52._16_16_ = auVar127;
        auVar52._0_16_ = auVar64;
        auVar101._0_4_ = auVar167._0_4_ + 1.0;
        auVar101._4_4_ = auVar167._4_4_ + 1.0;
        auVar101._8_4_ = auVar167._8_4_ + 1.0;
        auVar101._12_4_ = auVar167._12_4_ + 1.0;
        auVar101._16_4_ = 0x3f800000;
        auVar101._20_4_ = 0x3f800000;
        auVar101._24_4_ = 0x3f800000;
        auVar101._28_4_ = 0x3f800000;
        auVar104 = vcvtdq2ps_avx(auVar52);
        auVar141 = vcmpps_avx(auVar104,_DAT_0053be40,0);
        auVar104 = vandps_avx(auVar141,ZEXT1632(auVar165));
        auVar141 = vandnps_avx(auVar141,auVar101);
        auVar53._0_4_ = auVar44._0_4_ ^ auVar164._0_4_ ^ (uint)(auVar141._0_4_ + auVar104._0_4_);
        auVar53._4_4_ = auVar44._4_4_ ^ auVar164._4_4_ ^ (uint)(auVar141._4_4_ + auVar104._4_4_);
        auVar53._8_4_ = auVar44._8_4_ ^ auVar164._8_4_ ^ (uint)(auVar141._8_4_ + auVar104._8_4_);
        auVar53._12_4_ =
             auVar44._12_4_ ^ auVar164._12_4_ ^ (uint)(auVar141._12_4_ + auVar104._12_4_);
        auVar53._16_4_ = auVar44._16_4_ ^ auVar118._0_4_ ^ (uint)(auVar141._16_4_ + auVar104._16_4_)
        ;
        auVar53._20_4_ = auVar44._20_4_ ^ auVar118._4_4_ ^ (uint)(auVar141._20_4_ + auVar104._20_4_)
        ;
        auVar53._24_4_ = auVar44._24_4_ ^ auVar118._8_4_ ^ (uint)(auVar141._24_4_ + auVar104._24_4_)
        ;
        auVar53._28_4_ =
             auVar44._28_4_ ^ auVar118._12_4_ ^ (uint)(auVar141._28_4_ + auVar104._28_4_);
        *pauVar26 = auVar53;
        pauVar26 = pauVar26 + 1;
        iVar27 = iVar27 + 8;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar76._8_4_ = 0x7fffffff;
        auVar76._0_8_ = 0x7fffffff7fffffff;
        auVar76._12_4_ = 0x7fffffff;
        auVar118 = vandps_avx(*(undefined1 (*) [16])*pauVar26,auVar76);
        auVar77._0_4_ = (int)(auVar118._0_4_ * 1.2732395);
        auVar77._4_4_ = (int)(auVar118._4_4_ * 1.2732395);
        auVar77._8_4_ = (int)(auVar118._8_4_ * 1.2732395);
        auVar77._12_4_ = (int)(auVar118._12_4_ * 1.2732395);
        auVar363 = vpsubd_avx(auVar77,auVar164);
        auVar160._8_4_ = 0xfffffffe;
        auVar160._0_8_ = 0xfffffffefffffffe;
        auVar160._12_4_ = 0xfffffffe;
        auVar64 = vpand_avx(auVar363,auVar160);
        auVar64 = vcvtdq2ps_avx(auVar64);
        auVar210._8_4_ = 0xbf490000;
        auVar210._0_8_ = 0xbf490000bf490000;
        auVar210._12_4_ = 0xbf490000;
        auVar118 = vfmadd231ps_fma(auVar118,auVar64,auVar210);
        auVar211._8_4_ = 0xb97da000;
        auVar211._0_8_ = 0xb97da000b97da000;
        auVar211._12_4_ = 0xb97da000;
        auVar118 = vfmadd231ps_fma(auVar118,auVar64,auVar211);
        auVar212._8_4_ = 0xb3222169;
        auVar212._0_8_ = 0xb3222169b3222169;
        auVar212._12_4_ = 0xb3222169;
        auVar64 = vfmadd231ps_fma(auVar118,auVar212,auVar64);
        auVar161._0_4_ = auVar64._0_4_ * auVar64._0_4_;
        auVar161._4_4_ = auVar64._4_4_ * auVar64._4_4_;
        auVar161._8_4_ = auVar64._8_4_ * auVar64._8_4_;
        auVar161._12_4_ = auVar64._12_4_ * auVar64._12_4_;
        auVar213._8_4_ = 0x37ccf5ce;
        auVar213._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar213._12_4_ = 0x37ccf5ce;
        auVar253._8_4_ = 0xbab6061a;
        auVar253._0_8_ = 0xbab6061abab6061a;
        auVar253._12_4_ = 0xbab6061a;
        auVar118 = vfmadd213ps_fma(auVar213,auVar161,auVar253);
        auVar254._8_4_ = 0x3d2aaaa5;
        auVar254._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar254._12_4_ = 0x3d2aaaa5;
        auVar118 = vfmadd213ps_fma(auVar118,auVar161,auVar254);
        auVar214._0_4_ = auVar161._0_4_ * auVar161._0_4_ * auVar118._0_4_;
        auVar214._4_4_ = auVar161._4_4_ * auVar161._4_4_ * auVar118._4_4_;
        auVar214._8_4_ = auVar161._8_4_ * auVar161._8_4_ * auVar118._8_4_;
        auVar214._12_4_ = auVar161._12_4_ * auVar161._12_4_ * auVar118._12_4_;
        auVar255._8_4_ = 0x3f000000;
        auVar255._0_8_ = 0x3f0000003f000000;
        auVar255._12_4_ = 0x3f000000;
        auVar165 = vfnmadd231ps_fma(auVar214,auVar161,auVar255);
        auVar256._8_4_ = 0xb94ca1f9;
        auVar256._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar256._12_4_ = 0xb94ca1f9;
        auVar332._8_4_ = 0x3c08839e;
        auVar332._0_8_ = 0x3c08839e3c08839e;
        auVar332._12_4_ = 0x3c08839e;
        auVar118 = vfmadd213ps_fma(auVar256,auVar161,auVar332);
        auVar333._8_4_ = 0xbe2aaaa3;
        auVar333._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar333._12_4_ = 0xbe2aaaa3;
        auVar118 = vfmadd213ps_fma(auVar118,auVar161,auVar333);
        auVar162._0_4_ = auVar118._0_4_ * auVar161._0_4_;
        auVar162._4_4_ = auVar118._4_4_ * auVar161._4_4_;
        auVar162._8_4_ = auVar118._8_4_ * auVar161._8_4_;
        auVar162._12_4_ = auVar118._12_4_ * auVar161._12_4_;
        auVar64 = vfmadd213ps_fma(auVar162,auVar64,auVar64);
        auVar118 = vpand_avx(auVar127,auVar363);
        auVar118 = vpcmpeqd_avx(auVar118,_DAT_00538060);
        auVar215._0_4_ = auVar165._0_4_ + 1.0;
        auVar215._4_4_ = auVar165._4_4_ + 1.0;
        auVar215._8_4_ = auVar165._8_4_ + 1.0;
        auVar215._12_4_ = auVar165._12_4_ + 1.0;
        auVar118 = vblendvps_avx(auVar215,auVar64,auVar118);
        auVar64 = vpslld_avx(auVar363,0x1d);
        auVar78._8_4_ = 0x80000000;
        auVar78._0_8_ = 0x8000000080000000;
        auVar78._12_4_ = 0x80000000;
        auVar64 = vpand_avx(auVar64 ^ *(undefined1 (*) [16])*pauVar26,auVar78);
        *(undefined1 (*) [16])*pauVar26 = auVar64 ^ auVar118;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar164 = auVar392._0_16_;
        fVar28 = sinf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        auVar396 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
        auVar164 = vpcmpeqd_avx(auVar164,auVar164);
        auVar392 = ZEXT1664(auVar164);
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 10:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    auVar164 = vpcmpeqd_avx(auVar127,auVar127);
    auVar392 = ZEXT1664(auVar164);
    auVar396 = ZEXT1664(CONCAT412(0xfffffffe,CONCAT48(0xfffffffe,0xfffffffefffffffe)));
    auVar41._8_8_ = 0x8000000080000000;
    auVar41._0_8_ = 0x8000000080000000;
    auVar395 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      iVar27 = 0;
      while( true ) {
        auVar164 = auVar392._0_16_;
        auVar118 = auVar395._0_16_;
        auVar127 = auVar396._0_16_;
        if (iVar20 <= iVar27 + 7) break;
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        auVar59._16_4_ = 0x7fffffff;
        auVar59._20_4_ = 0x7fffffff;
        auVar59._24_4_ = 0x7fffffff;
        auVar59._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar59,*pauVar26);
        auVar86._0_4_ = (int)(auVar104._0_4_ * 1.2732395);
        auVar86._4_4_ = (int)(auVar104._4_4_ * 1.2732395);
        auVar86._8_4_ = (int)(auVar104._8_4_ * 1.2732395);
        auVar86._12_4_ = (int)(auVar104._12_4_ * 1.2732395);
        auVar109._16_4_ = (int)(auVar104._16_4_ * 1.2732395);
        auVar109._0_16_ = auVar86;
        auVar109._20_4_ = (int)(auVar104._20_4_ * 1.2732395);
        auVar109._24_4_ = (int)(auVar104._24_4_ * 1.2732395);
        auVar109._28_4_ = 1;
        auVar64 = vpsubd_avx(auVar86,auVar164);
        auVar363 = vpsubd_avx(auVar109._16_16_,auVar164);
        auVar19._8_8_ = 0xfffffffefffffffe;
        auVar19._0_8_ = 0xfffffffefffffffe;
        auVar164 = vpand_avx(auVar64,auVar19);
        auVar64 = vpand_avx(auVar363,auVar19);
        auVar195._16_16_ = auVar64;
        auVar195._0_16_ = auVar164;
        auVar44 = vcvtdq2ps_avx(auVar195);
        auVar164 = vpaddd_avx(auVar127,auVar164);
        auVar127 = vpaddd_avx(auVar127,auVar64);
        auVar64 = vpslld_avx(auVar164,0x1d);
        auVar64 = vpandn_avx(auVar64,auVar41);
        auVar363 = vpslld_avx(auVar127,0x1d);
        auVar363 = vpandn_avx(auVar363,auVar41);
        auVar304._8_4_ = 0xbf490000;
        auVar304._0_8_ = 0xbf490000bf490000;
        auVar304._12_4_ = 0xbf490000;
        auVar304._16_4_ = 0xbf490000;
        auVar304._20_4_ = 0xbf490000;
        auVar304._24_4_ = 0xbf490000;
        auVar304._28_4_ = 0xbf490000;
        auVar165 = vfmadd231ps_fma(auVar104,auVar44,auVar304);
        auVar305._8_4_ = 0xb97da000;
        auVar305._0_8_ = 0xb97da000b97da000;
        auVar305._12_4_ = 0xb97da000;
        auVar305._16_4_ = 0xb97da000;
        auVar305._20_4_ = 0xb97da000;
        auVar305._24_4_ = 0xb97da000;
        auVar305._28_4_ = 0xb97da000;
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar44,auVar305);
        auVar306._8_4_ = 0xb3222169;
        auVar306._0_8_ = 0xb3222169b3222169;
        auVar306._12_4_ = 0xb3222169;
        auVar306._16_4_ = 0xb3222169;
        auVar306._20_4_ = 0xb3222169;
        auVar306._24_4_ = 0xb3222169;
        auVar306._28_4_ = 0xb3222169;
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar306,auVar44);
        fVar28 = auVar166._0_4_;
        fVar201 = fVar28 * fVar28;
        fVar198 = auVar166._4_4_;
        fVar202 = fVar198 * fVar198;
        fVar199 = auVar166._8_4_;
        fVar203 = fVar199 * fVar199;
        fVar200 = auVar166._12_4_;
        fVar112 = fVar200 * fVar200;
        auVar15._28_4_ = auVar44._28_4_;
        auVar15._0_28_ = ZEXT1628(CONCAT412(fVar112,CONCAT48(fVar203,CONCAT44(fVar202,fVar201))));
        auVar307._8_4_ = 0xb94ca1f9;
        auVar307._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar307._12_4_ = 0xb94ca1f9;
        auVar307._16_4_ = 0xb94ca1f9;
        auVar307._20_4_ = 0xb94ca1f9;
        auVar307._24_4_ = 0xb94ca1f9;
        auVar307._28_4_ = 0xb94ca1f9;
        auVar359._8_4_ = 0x3c08839e;
        auVar359._0_8_ = 0x3c08839e3c08839e;
        auVar359._12_4_ = 0x3c08839e;
        auVar359._16_4_ = 0x3c08839e;
        auVar359._20_4_ = 0x3c08839e;
        auVar359._24_4_ = 0x3c08839e;
        auVar359._28_4_ = 0x3c08839e;
        auVar165 = vfmadd213ps_fma(auVar307,auVar15,auVar359);
        auVar360._8_4_ = 0xbe2aaaa3;
        auVar360._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar360._12_4_ = 0xbe2aaaa3;
        auVar360._16_4_ = 0xbe2aaaa3;
        auVar360._20_4_ = 0xbe2aaaa3;
        auVar360._24_4_ = 0xbe2aaaa3;
        auVar360._28_4_ = 0xbe2aaaa3;
        auVar165 = vfmadd213ps_fma(ZEXT1632(auVar165),auVar15,auVar360);
        auVar16._28_4_ = 0xbe2aaaa3;
        auVar16._0_28_ =
             ZEXT1628(CONCAT412(fVar112 * fVar200,
                                CONCAT48(fVar203 * fVar199,
                                         CONCAT44(fVar202 * fVar198,fVar201 * fVar28))));
        auVar165 = vfmadd213ps_fma(auVar16,ZEXT1632(auVar165),ZEXT1632(auVar166));
        auVar60._8_4_ = 0x37ccf5ce;
        auVar60._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar60._12_4_ = 0x37ccf5ce;
        auVar60._16_4_ = 0x37ccf5ce;
        auVar60._20_4_ = 0x37ccf5ce;
        auVar60._24_4_ = 0x37ccf5ce;
        auVar60._28_4_ = 0x37ccf5ce;
        auVar308._8_4_ = 0xbab6061a;
        auVar308._0_8_ = 0xbab6061abab6061a;
        auVar308._12_4_ = 0xbab6061a;
        auVar308._16_4_ = 0xbab6061a;
        auVar308._20_4_ = 0xbab6061a;
        auVar308._24_4_ = 0xbab6061a;
        auVar308._28_4_ = 0xbab6061a;
        auVar166 = vfmadd213ps_fma(auVar60,auVar15,auVar308);
        auVar309._8_4_ = 0x3d2aaaa5;
        auVar309._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar309._12_4_ = 0x3d2aaaa5;
        auVar309._16_4_ = 0x3d2aaaa5;
        auVar309._20_4_ = 0x3d2aaaa5;
        auVar309._24_4_ = 0x3d2aaaa5;
        auVar309._28_4_ = 0x3d2aaaa5;
        auVar166 = vfmadd213ps_fma(ZEXT1632(auVar166),auVar15,auVar309);
        auVar310._8_4_ = 0x3f000000;
        auVar310._0_8_ = 0x3f0000003f000000;
        auVar310._12_4_ = 0x3f000000;
        auVar310._16_4_ = 0x3f000000;
        auVar310._20_4_ = 0x3f000000;
        auVar310._24_4_ = 0x3f000000;
        auVar310._28_4_ = 0x3f000000;
        auVar166 = vfnmadd231ps_fma(ZEXT1632(CONCAT412(fVar112 * fVar112 * auVar166._12_4_,
                                                       CONCAT48(fVar203 * fVar203 * auVar166._8_4_,
                                                                CONCAT44(fVar202 * fVar202 *
                                                                         auVar166._4_4_,
                                                                         fVar201 * fVar201 *
                                                                         auVar166._0_4_)))),auVar15,
                                    auVar310);
        auVar164 = vpand_avx(auVar118,auVar164);
        auVar127 = vpand_avx(auVar118,auVar127);
        auVar144._16_16_ = auVar127;
        auVar144._0_16_ = auVar164;
        auVar61._0_4_ = auVar166._0_4_ + 1.0;
        auVar61._4_4_ = auVar166._4_4_ + 1.0;
        auVar61._8_4_ = auVar166._8_4_ + 1.0;
        auVar61._12_4_ = auVar166._12_4_ + 1.0;
        auVar61._16_4_ = 0x3f800000;
        auVar61._20_4_ = 0x3f800000;
        auVar61._24_4_ = 0x3f800000;
        auVar61._28_4_ = 0x3f800000;
        auVar104 = vcvtdq2ps_avx(auVar144);
        auVar44 = vcmpps_avx(auVar104,_DAT_0053be40,0);
        auVar104 = vandps_avx(auVar44,ZEXT1632(auVar165));
        auVar44 = vandnps_avx(auVar44,auVar61);
        auVar62._0_4_ = auVar64._0_4_ ^ (uint)(auVar104._0_4_ + auVar44._0_4_);
        auVar62._4_4_ = auVar64._4_4_ ^ (uint)(auVar104._4_4_ + auVar44._4_4_);
        auVar62._8_4_ = auVar64._8_4_ ^ (uint)(auVar104._8_4_ + auVar44._8_4_);
        auVar62._12_4_ = auVar64._12_4_ ^ (uint)(auVar104._12_4_ + auVar44._12_4_);
        auVar62._16_4_ = auVar363._0_4_ ^ (uint)(auVar104._16_4_ + auVar44._16_4_);
        auVar62._20_4_ = auVar363._4_4_ ^ (uint)(auVar104._20_4_ + auVar44._20_4_);
        auVar62._24_4_ = auVar363._8_4_ ^ (uint)(auVar104._24_4_ + auVar44._24_4_);
        auVar62._28_4_ = auVar363._12_4_ ^ (uint)(auVar104._28_4_ + auVar44._28_4_);
        *pauVar26 = auVar62;
        pauVar26 = pauVar26 + 1;
        iVar27 = iVar27 + 8;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar42._8_4_ = 0x7fffffff;
        auVar42._0_8_ = 0x7fffffff7fffffff;
        auVar42._12_4_ = 0x7fffffff;
        auVar64 = vandps_avx(auVar42,*(undefined1 (*) [16])*pauVar26);
        auVar87._0_4_ = (int)(auVar64._0_4_ * 1.2732395);
        auVar87._4_4_ = (int)(auVar64._4_4_ * 1.2732395);
        auVar87._8_4_ = (int)(auVar64._8_4_ * 1.2732395);
        auVar87._12_4_ = (int)(auVar64._12_4_ * 1.2732395);
        auVar363 = vpsubd_avx(auVar87,auVar164);
        auVar165 = vpand_avx(auVar127,auVar363);
        auVar363 = vcvtdq2ps_avx(auVar165);
        auVar173._8_4_ = 0xbf490000;
        auVar173._0_8_ = 0xbf490000bf490000;
        auVar173._12_4_ = 0xbf490000;
        auVar64 = vfmadd231ps_fma(auVar64,auVar363,auVar173);
        auVar174._8_4_ = 0xb97da000;
        auVar174._0_8_ = 0xb97da000b97da000;
        auVar174._12_4_ = 0xb97da000;
        auVar64 = vfmadd231ps_fma(auVar64,auVar363,auVar174);
        auVar175._8_4_ = 0xb3222169;
        auVar175._0_8_ = 0xb3222169b3222169;
        auVar175._12_4_ = 0xb3222169;
        auVar166 = vfmadd231ps_fma(auVar64,auVar175,auVar363);
        auVar128._0_4_ = auVar166._0_4_ * auVar166._0_4_;
        auVar128._4_4_ = auVar166._4_4_ * auVar166._4_4_;
        auVar128._8_4_ = auVar166._8_4_ * auVar166._8_4_;
        auVar128._12_4_ = auVar166._12_4_ * auVar166._12_4_;
        auVar176._8_4_ = 0x37ccf5ce;
        auVar176._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar176._12_4_ = 0x37ccf5ce;
        auVar221._8_4_ = 0xbab6061a;
        auVar221._0_8_ = 0xbab6061abab6061a;
        auVar221._12_4_ = 0xbab6061a;
        auVar64 = vfmadd213ps_fma(auVar176,auVar128,auVar221);
        auVar222._8_4_ = 0x3d2aaaa5;
        auVar222._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar222._12_4_ = 0x3d2aaaa5;
        auVar64 = vfmadd213ps_fma(auVar64,auVar128,auVar222);
        auVar177._0_4_ = auVar128._0_4_ * auVar128._0_4_ * auVar64._0_4_;
        auVar177._4_4_ = auVar128._4_4_ * auVar128._4_4_ * auVar64._4_4_;
        auVar177._8_4_ = auVar128._8_4_ * auVar128._8_4_ * auVar64._8_4_;
        auVar177._12_4_ = auVar128._12_4_ * auVar128._12_4_ * auVar64._12_4_;
        auVar223._8_4_ = 0x3f000000;
        auVar223._0_8_ = 0x3f0000003f000000;
        auVar223._12_4_ = 0x3f000000;
        auVar167 = vfnmadd231ps_fma(auVar177,auVar128,auVar223);
        auVar224._8_4_ = 0xb94ca1f9;
        auVar224._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar224._12_4_ = 0xb94ca1f9;
        auVar271._8_4_ = 0x3c08839e;
        auVar271._0_8_ = 0x3c08839e3c08839e;
        auVar271._12_4_ = 0x3c08839e;
        auVar64 = vfmadd213ps_fma(auVar224,auVar128,auVar271);
        auVar272._8_4_ = 0xbe2aaaa3;
        auVar272._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar272._12_4_ = 0xbe2aaaa3;
        auVar64 = vfmadd213ps_fma(auVar64,auVar128,auVar272);
        auVar129._0_4_ = auVar64._0_4_ * auVar128._0_4_;
        auVar129._4_4_ = auVar64._4_4_ * auVar128._4_4_;
        auVar129._8_4_ = auVar64._8_4_ * auVar128._8_4_;
        auVar129._12_4_ = auVar64._12_4_ * auVar128._12_4_;
        auVar363 = vpaddd_avx(auVar127,auVar165);
        auVar165 = vfmadd213ps_fma(auVar129,auVar166,auVar166);
        auVar64 = vpand_avx(auVar118,auVar363);
        auVar64 = vpcmpeqd_avx(auVar64,_DAT_00538060);
        auVar178._0_4_ = auVar167._0_4_ + 1.0;
        auVar178._4_4_ = auVar167._4_4_ + 1.0;
        auVar178._8_4_ = auVar167._8_4_ + 1.0;
        auVar178._12_4_ = auVar167._12_4_ + 1.0;
        auVar64 = vblendvps_avx(auVar178,auVar165,auVar64);
        auVar363 = vpslld_avx(auVar363,0x1d);
        auVar130._8_4_ = 0x80000000;
        auVar130._0_8_ = 0x8000000080000000;
        auVar130._12_4_ = 0x80000000;
        auVar363 = vpand_avx(auVar363,auVar130);
        *(undefined1 (*) [16])*pauVar26 = auVar363 ^ auVar130 ^ auVar64;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar164 = auVar392._0_16_;
        fVar28 = cosf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        auVar395 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
        auVar396 = ZEXT1664(CONCAT412(0xfffffffe,CONCAT48(0xfffffffe,0xfffffffefffffffe)));
        auVar164 = vpcmpeqd_avx(auVar164,auVar164);
        auVar392 = ZEXT1664(auVar164);
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 0xb:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    auVar164 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
    auVar392 = ZEXT1664(auVar164);
    auVar34._8_8_ = 0x8000000080000000;
    auVar34._0_8_ = 0x8000000080000000;
    auVar396 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      iVar27 = 0;
      while( true ) {
        auVar164 = auVar392._0_16_;
        auVar127 = auVar396._0_16_;
        if (iVar20 <= iVar27 + 7) break;
        auVar47._8_4_ = 0x7fffffff;
        auVar47._0_8_ = 0x7fffffff7fffffff;
        auVar47._12_4_ = 0x7fffffff;
        auVar47._16_4_ = 0x7fffffff;
        auVar47._20_4_ = 0x7fffffff;
        auVar47._24_4_ = 0x7fffffff;
        auVar47._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(*pauVar26,auVar47);
        auVar133._8_4_ = 0x80000000;
        auVar133._0_8_ = 0x8000000080000000;
        auVar133._12_4_ = 0x80000000;
        auVar133._16_4_ = 0x80000000;
        auVar133._20_4_ = 0x80000000;
        auVar133._24_4_ = 0x80000000;
        auVar133._28_4_ = 0x80000000;
        auVar44 = vandps_avx(*pauVar26,auVar133);
        auVar117._0_4_ = (int)(auVar104._0_4_ * 1.2732395);
        auVar117._4_4_ = (int)(auVar104._4_4_ * 1.2732395);
        auVar117._8_4_ = (int)(auVar104._8_4_ * 1.2732395);
        auVar117._12_4_ = (int)(auVar104._12_4_ * 1.2732395);
        auVar134._16_4_ = (int)(auVar104._16_4_ * 1.2732395);
        auVar134._0_16_ = auVar117;
        auVar134._20_4_ = (int)(auVar104._20_4_ * 1.2732395);
        auVar134._24_4_ = (int)(auVar104._24_4_ * 1.2732395);
        auVar134._28_4_ = 1;
        auVar166 = vpsubd_avx(auVar117,auVar164);
        auVar167 = vpsubd_avx(auVar134._16_16_,auVar164);
        auVar17._8_8_ = 0xfffffffefffffffe;
        auVar17._0_8_ = 0xfffffffefffffffe;
        auVar164 = vpand_avx(auVar166,auVar17);
        auVar118 = vpand_avx(auVar167,auVar17);
        auVar64 = vpslld_avx(auVar166,0x1d);
        auVar64 = vpand_avx(auVar34,auVar64);
        auVar363 = vpslld_avx(auVar167,0x1d);
        auVar363 = vpand_avx(auVar34,auVar363);
        auVar375._16_16_ = auVar118;
        auVar375._0_16_ = auVar164;
        auVar141 = vcvtdq2ps_avx(auVar375);
        auVar344._8_4_ = 0xbf490000;
        auVar344._0_8_ = 0xbf490000bf490000;
        auVar344._12_4_ = 0xbf490000;
        auVar344._16_4_ = 0xbf490000;
        auVar344._20_4_ = 0xbf490000;
        auVar344._24_4_ = 0xbf490000;
        auVar344._28_4_ = 0xbf490000;
        auVar165 = vfmadd231ps_fma(auVar104,auVar141,auVar344);
        auVar345._8_4_ = 0xb97da000;
        auVar345._0_8_ = 0xb97da000b97da000;
        auVar345._12_4_ = 0xb97da000;
        auVar345._16_4_ = 0xb97da000;
        auVar345._20_4_ = 0xb97da000;
        auVar345._24_4_ = 0xb97da000;
        auVar345._28_4_ = 0xb97da000;
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar141,auVar345);
        auVar346._8_4_ = 0xb3222169;
        auVar346._0_8_ = 0xb3222169b3222169;
        auVar346._12_4_ = 0xb3222169;
        auVar346._16_4_ = 0xb3222169;
        auVar346._20_4_ = 0xb3222169;
        auVar346._24_4_ = 0xb3222169;
        auVar346._28_4_ = 0xb3222169;
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar346,auVar141);
        auVar164 = vpslld_avx(auVar164,0x1d);
        auVar324._8_4_ = 0xc0000000;
        auVar324._0_8_ = 0xc0000000c0000000;
        auVar324._12_4_ = 0xc0000000;
        auVar164 = vpaddd_avx(auVar164,auVar324);
        auVar165 = vpandn_avx(auVar164,auVar34);
        auVar164 = vpslld_avx(auVar118,0x1d);
        auVar164 = vpaddd_avx(auVar164,auVar324);
        auVar118 = vpandn_avx(auVar164,auVar34);
        fVar28 = auVar168._0_4_ * auVar168._0_4_;
        fVar198 = auVar168._4_4_ * auVar168._4_4_;
        fVar199 = auVar168._8_4_ * auVar168._8_4_;
        fVar200 = auVar168._12_4_ * auVar168._12_4_;
        auVar104 = ZEXT1632(CONCAT412(fVar200,CONCAT48(fVar199,CONCAT44(fVar198,fVar28))));
        auVar347._8_4_ = 0x37ccf5ce;
        auVar347._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar347._12_4_ = 0x37ccf5ce;
        auVar347._16_4_ = 0x37ccf5ce;
        auVar347._20_4_ = 0x37ccf5ce;
        auVar347._24_4_ = 0x37ccf5ce;
        auVar347._28_4_ = 0x37ccf5ce;
        auVar376._8_4_ = 0xbab6061a;
        auVar376._0_8_ = 0xbab6061abab6061a;
        auVar376._12_4_ = 0xbab6061a;
        auVar376._16_4_ = 0xbab6061a;
        auVar376._20_4_ = 0xbab6061a;
        auVar376._24_4_ = 0xbab6061a;
        auVar376._28_4_ = 0xbab6061a;
        auVar164 = vfmadd213ps_fma(auVar347,auVar104,auVar376);
        auVar377._8_4_ = 0x3d2aaaa5;
        auVar377._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar377._12_4_ = 0x3d2aaaa5;
        auVar377._16_4_ = 0x3d2aaaa5;
        auVar377._20_4_ = 0x3d2aaaa5;
        auVar377._24_4_ = 0x3d2aaaa5;
        auVar377._28_4_ = 0x3d2aaaa5;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar104,auVar377);
        auVar378._8_4_ = 0x3f000000;
        auVar378._0_8_ = 0x3f0000003f000000;
        auVar378._12_4_ = 0x3f000000;
        auVar378._16_4_ = 0x3f000000;
        auVar378._20_4_ = 0x3f000000;
        auVar378._24_4_ = 0x3f000000;
        auVar378._28_4_ = 0x3f000000;
        auVar217 = vfnmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * fVar200 * auVar164._12_4_,
                                                       CONCAT48(fVar199 * fVar199 * auVar164._8_4_,
                                                                CONCAT44(fVar198 * fVar198 *
                                                                         auVar164._4_4_,
                                                                         fVar28 * fVar28 *
                                                                         auVar164._0_4_)))),auVar104
                                    ,auVar378);
        auVar379._8_4_ = 0xb94ca1f9;
        auVar379._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar379._12_4_ = 0xb94ca1f9;
        auVar379._16_4_ = 0xb94ca1f9;
        auVar379._20_4_ = 0xb94ca1f9;
        auVar379._24_4_ = 0xb94ca1f9;
        auVar379._28_4_ = 0xb94ca1f9;
        auVar393._8_4_ = 0x3c08839e;
        auVar393._0_8_ = 0x3c08839e3c08839e;
        auVar393._12_4_ = 0x3c08839e;
        auVar393._16_4_ = 0x3c08839e;
        auVar393._20_4_ = 0x3c08839e;
        auVar393._24_4_ = 0x3c08839e;
        auVar393._28_4_ = 0x3c08839e;
        auVar164 = vfmadd213ps_fma(auVar379,auVar104,auVar393);
        auVar394._8_4_ = 0xbe2aaaa3;
        auVar394._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar394._12_4_ = 0xbe2aaaa3;
        auVar394._16_4_ = 0xbe2aaaa3;
        auVar394._20_4_ = 0xbe2aaaa3;
        auVar394._24_4_ = 0xbe2aaaa3;
        auVar394._28_4_ = 0xbe2aaaa3;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar104,auVar394);
        auVar168 = vfmadd213ps_fma(ZEXT1632(CONCAT412(auVar164._12_4_ * fVar200,
                                                      CONCAT48(auVar164._8_4_ * fVar199,
                                                               CONCAT44(auVar164._4_4_ * fVar198,
                                                                        auVar164._0_4_ * fVar28)))),
                                   ZEXT1632(auVar168),ZEXT1632(auVar168));
        auVar164 = vpand_avx(auVar127,auVar166);
        auVar127 = vpand_avx(auVar127,auVar167);
        auVar135._0_4_ = auVar217._0_4_ + 1.0;
        auVar135._4_4_ = auVar217._4_4_ + 1.0;
        auVar135._8_4_ = auVar217._8_4_ + 1.0;
        auVar135._12_4_ = auVar217._12_4_ + 1.0;
        auVar135._16_4_ = 0x3f800000;
        auVar135._20_4_ = 0x3f800000;
        auVar135._24_4_ = 0x3f800000;
        auVar135._28_4_ = 0x3f800000;
        auVar48._16_16_ = auVar127;
        auVar48._0_16_ = auVar164;
        auVar104 = vcvtdq2ps_avx(auVar48);
        auVar141 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,0);
        auVar104 = vandps_avx(auVar141,ZEXT1632(auVar168));
        auVar141 = vandnps_avx(auVar141,auVar135);
        auVar49._0_4_ = auVar141._0_4_ + auVar104._0_4_;
        auVar49._4_4_ = auVar141._4_4_ + auVar104._4_4_;
        auVar49._8_4_ = auVar141._8_4_ + auVar104._8_4_;
        auVar49._12_4_ = auVar141._12_4_ + auVar104._12_4_;
        auVar49._16_4_ = auVar141._16_4_ + auVar104._16_4_;
        auVar49._20_4_ = auVar141._20_4_ + auVar104._20_4_;
        auVar49._24_4_ = auVar141._24_4_ + auVar104._24_4_;
        auVar49._28_4_ = auVar141._28_4_ + auVar104._28_4_;
        auVar96._0_4_ = auVar135._0_4_ + auVar168._0_4_;
        auVar96._4_4_ = auVar135._4_4_ + auVar168._4_4_;
        auVar96._8_4_ = auVar135._8_4_ + auVar168._8_4_;
        auVar96._12_4_ = auVar135._12_4_ + auVar168._12_4_;
        auVar96._16_4_ = 0x3f800000;
        auVar96._20_4_ = 0x3f800000;
        auVar96._24_4_ = 0x3f800000;
        auVar96._28_4_ = 0x3f800000;
        auVar104 = vsubps_avx(auVar96,auVar49);
        auVar97._0_4_ = (float)(auVar165._0_4_ ^ auVar104._0_4_);
        auVar97._4_4_ = (float)(auVar165._4_4_ ^ auVar104._4_4_);
        auVar97._8_4_ = (float)(auVar165._8_4_ ^ auVar104._8_4_);
        auVar97._12_4_ = (float)(auVar165._12_4_ ^ auVar104._12_4_);
        auVar97._16_4_ = (float)(auVar118._0_4_ ^ auVar104._16_4_);
        auVar97._20_4_ = (float)(auVar118._4_4_ ^ auVar104._20_4_);
        auVar97._24_4_ = (float)(auVar118._8_4_ ^ auVar104._24_4_);
        auVar97._28_4_ = (float)(auVar118._12_4_ ^ auVar104._28_4_);
        auVar50._0_4_ = auVar44._0_4_ ^ auVar64._0_4_ ^ (uint)auVar49._0_4_;
        auVar50._4_4_ = auVar44._4_4_ ^ auVar64._4_4_ ^ (uint)auVar49._4_4_;
        auVar50._8_4_ = auVar44._8_4_ ^ auVar64._8_4_ ^ (uint)auVar49._8_4_;
        auVar50._12_4_ = auVar44._12_4_ ^ auVar64._12_4_ ^ (uint)auVar49._12_4_;
        auVar50._16_4_ = auVar44._16_4_ ^ auVar363._0_4_ ^ (uint)auVar49._16_4_;
        auVar50._20_4_ = auVar44._20_4_ ^ auVar363._4_4_ ^ (uint)auVar49._20_4_;
        auVar50._24_4_ = auVar44._24_4_ ^ auVar363._8_4_ ^ (uint)auVar49._24_4_;
        auVar50._28_4_ = auVar44._28_4_ ^ auVar363._12_4_ ^ (uint)auVar49._28_4_;
        auVar104 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,0);
        auVar187._8_4_ = 0x322bcc77;
        auVar187._0_8_ = 0x322bcc77322bcc77;
        auVar187._12_4_ = 0x322bcc77;
        auVar187._16_4_ = 0x322bcc77;
        auVar187._20_4_ = 0x322bcc77;
        auVar187._24_4_ = 0x322bcc77;
        auVar187._28_4_ = 0x322bcc77;
        auVar104 = vandps_avx(auVar104,auVar187);
        auVar98._0_4_ = auVar104._0_4_ + auVar97._0_4_;
        auVar98._4_4_ = auVar104._4_4_ + auVar97._4_4_;
        auVar98._8_4_ = auVar104._8_4_ + auVar97._8_4_;
        auVar98._12_4_ = auVar104._12_4_ + auVar97._12_4_;
        auVar98._16_4_ = auVar104._16_4_ + auVar97._16_4_;
        auVar98._20_4_ = auVar104._20_4_ + auVar97._20_4_;
        auVar98._24_4_ = auVar104._24_4_ + auVar97._24_4_;
        auVar98._28_4_ = auVar104._28_4_ + auVar97._28_4_;
        auVar104 = vdivps_avx(auVar50,auVar98);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        iVar27 = iVar27 + 8;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar71._8_4_ = 0x7fffffff;
        auVar71._0_8_ = 0x7fffffff7fffffff;
        auVar71._12_4_ = 0x7fffffff;
        auVar118 = vandps_avx(*(undefined1 (*) [16])*pauVar26,auVar71);
        auVar72._0_4_ = (int)(auVar118._0_4_ * 1.2732395);
        auVar72._4_4_ = (int)(auVar118._4_4_ * 1.2732395);
        auVar72._8_4_ = (int)(auVar118._8_4_ * 1.2732395);
        auVar72._12_4_ = (int)(auVar118._12_4_ * 1.2732395);
        auVar165 = vpsubd_avx(auVar72,auVar164);
        auVar206._8_4_ = 0xfffffffe;
        auVar206._0_8_ = 0xfffffffefffffffe;
        auVar206._12_4_ = 0xfffffffe;
        auVar64 = vpand_avx(auVar165,auVar206);
        auVar64 = vcvtdq2ps_avx(auVar64);
        auVar245._8_4_ = 0xbf490000;
        auVar245._0_8_ = 0xbf490000bf490000;
        auVar245._12_4_ = 0xbf490000;
        auVar118 = vfmadd231ps_fma(auVar118,auVar64,auVar245);
        auVar246._8_4_ = 0xb97da000;
        auVar246._0_8_ = 0xb97da000b97da000;
        auVar246._12_4_ = 0xb97da000;
        auVar118 = vfmadd231ps_fma(auVar118,auVar64,auVar246);
        auVar247._8_4_ = 0xb3222169;
        auVar247._0_8_ = 0xb3222169b3222169;
        auVar247._12_4_ = 0xb3222169;
        auVar64 = vfmadd231ps_fma(auVar118,auVar247,auVar64);
        auVar207._0_4_ = auVar64._0_4_ * auVar64._0_4_;
        auVar207._4_4_ = auVar64._4_4_ * auVar64._4_4_;
        auVar207._8_4_ = auVar64._8_4_ * auVar64._8_4_;
        auVar207._12_4_ = auVar64._12_4_ * auVar64._12_4_;
        auVar248._8_4_ = 0x37ccf5ce;
        auVar248._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar248._12_4_ = 0x37ccf5ce;
        auVar325._8_4_ = 0xbab6061a;
        auVar325._0_8_ = 0xbab6061abab6061a;
        auVar325._12_4_ = 0xbab6061a;
        auVar118 = vfmadd213ps_fma(auVar248,auVar207,auVar325);
        auVar326._8_4_ = 0x3d2aaaa5;
        auVar326._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar326._12_4_ = 0x3d2aaaa5;
        auVar118 = vfmadd213ps_fma(auVar118,auVar207,auVar326);
        auVar249._0_4_ = auVar207._0_4_ * auVar207._0_4_ * auVar118._0_4_;
        auVar249._4_4_ = auVar207._4_4_ * auVar207._4_4_ * auVar118._4_4_;
        auVar249._8_4_ = auVar207._8_4_ * auVar207._8_4_ * auVar118._8_4_;
        auVar249._12_4_ = auVar207._12_4_ * auVar207._12_4_ * auVar118._12_4_;
        auVar327._8_4_ = 0x3f000000;
        auVar327._0_8_ = 0x3f0000003f000000;
        auVar327._12_4_ = 0x3f000000;
        auVar363 = vfnmadd231ps_fma(auVar249,auVar207,auVar327);
        auVar328._8_4_ = 0xb94ca1f9;
        auVar328._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar328._12_4_ = 0xb94ca1f9;
        auVar364._8_4_ = 0x3c08839e;
        auVar364._0_8_ = 0x3c08839e3c08839e;
        auVar364._12_4_ = 0x3c08839e;
        auVar118 = vfmadd213ps_fma(auVar328,auVar207,auVar364);
        auVar365._8_4_ = 0xbe2aaaa3;
        auVar365._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar365._12_4_ = 0xbe2aaaa3;
        auVar118 = vfmadd213ps_fma(auVar118,auVar207,auVar365);
        auVar208._0_4_ = auVar118._0_4_ * auVar207._0_4_;
        auVar208._4_4_ = auVar118._4_4_ * auVar207._4_4_;
        auVar208._8_4_ = auVar118._8_4_ * auVar207._8_4_;
        auVar208._12_4_ = auVar118._12_4_ * auVar207._12_4_;
        auVar118 = vpand_avx(auVar127,auVar165);
        auVar118 = vpcmpeqd_avx(auVar118,ZEXT816(0));
        auVar250._0_4_ = auVar363._0_4_ + 1.0;
        auVar250._4_4_ = auVar363._4_4_ + 1.0;
        auVar250._8_4_ = auVar363._8_4_ + 1.0;
        auVar250._12_4_ = auVar363._12_4_ + 1.0;
        auVar363 = vfmadd213ps_fma(auVar208,auVar64,auVar64);
        auVar64 = vblendvps_avx(auVar250,auVar363,auVar118);
        auVar363 = vblendvps_avx(auVar363,auVar250,auVar118);
        auVar118 = vpslld_avx(auVar165,0x1d);
        auVar251._8_4_ = 0x80000000;
        auVar251._0_8_ = 0x8000000080000000;
        auVar251._12_4_ = 0x80000000;
        auVar165 = vpand_avx(auVar118 ^ *(undefined1 (*) [16])*pauVar26,auVar251);
        auVar118 = vpslld_avx(auVar72,0x1d);
        auVar119._8_4_ = 0xe0000000;
        auVar119._0_8_ = 0xe0000000e0000000;
        auVar119._12_4_ = 0xe0000000;
        auVar118 = vpaddd_avx(auVar118,auVar119);
        auVar166 = vpand_avx(auVar118,auVar251);
        auVar118 = vcmpps_avx(auVar166 ^ auVar363 ^ auVar251,ZEXT816(0),0);
        auVar156._8_4_ = 0x322bcc77;
        auVar156._0_8_ = 0x322bcc77322bcc77;
        auVar156._12_4_ = 0x322bcc77;
        auVar118 = vandps_avx(auVar118,auVar156);
        auVar118 = vsubps_avx(auVar118,auVar166 ^ auVar363);
        auVar118 = vdivps_avx(auVar165 ^ auVar64,auVar118);
        *(undefined1 (*) [16])*pauVar26 = auVar118;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar164 = auVar392._0_16_;
        fVar28 = tanf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        auVar396 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
        auVar164 = vpcmpeqd_avx(auVar164,auVar164);
        auVar392 = ZEXT1664(auVar164);
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 0xc:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar99._8_4_ = 0x7fffffff;
        auVar99._0_8_ = 0x7fffffff7fffffff;
        auVar99._12_4_ = 0x7fffffff;
        auVar99._16_4_ = 0x7fffffff;
        auVar99._20_4_ = 0x7fffffff;
        auVar99._24_4_ = 0x7fffffff;
        auVar99._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(*pauVar26,auVar99);
        auVar188._8_4_ = 0x3f000000;
        auVar188._0_8_ = 0x3f0000003f000000;
        auVar188._12_4_ = 0x3f000000;
        auVar188._16_4_ = 0x3f000000;
        auVar188._20_4_ = 0x3f000000;
        auVar188._24_4_ = 0x3f000000;
        auVar188._28_4_ = 0x3f000000;
        auVar164 = vfnmadd213ps_fma(auVar188,auVar104,auVar188);
        auVar105 = vsqrtps_avx(ZEXT1632(auVar164));
        auVar141 = vcmpps_avx(auVar188,auVar104,1);
        auVar44 = vblendvps_avx(auVar104,auVar105,auVar141);
        fVar28 = auVar44._0_4_;
        fVar112 = fVar28 * fVar28;
        fVar198 = auVar44._4_4_;
        fVar146 = fVar198 * fVar198;
        auVar7._4_4_ = fVar146;
        auVar7._0_4_ = fVar112;
        fVar199 = auVar44._8_4_;
        fVar147 = fVar199 * fVar199;
        auVar7._8_4_ = fVar147;
        fVar200 = auVar44._12_4_;
        fVar148 = fVar200 * fVar200;
        auVar7._12_4_ = fVar148;
        fVar201 = auVar44._16_4_;
        fVar149 = fVar201 * fVar201;
        auVar7._16_4_ = fVar149;
        fVar202 = auVar44._20_4_;
        fVar150 = fVar202 * fVar202;
        auVar7._20_4_ = fVar150;
        fVar203 = auVar44._24_4_;
        fVar151 = fVar203 * fVar203;
        auVar7._24_4_ = fVar151;
        auVar7._28_4_ = auVar105._28_4_;
        auVar239._0_4_ = fVar112 * fVar112;
        auVar239._4_4_ = fVar146 * fVar146;
        auVar239._8_4_ = fVar147 * fVar147;
        auVar239._12_4_ = fVar148 * fVar148;
        auVar239._16_4_ = fVar149 * fVar149;
        auVar239._20_4_ = fVar150 * fVar150;
        auVar239._28_36_ = in_ZMM4._28_36_;
        auVar239._24_4_ = fVar151 * fVar151;
        auVar104 = auVar239._0_32_;
        auVar285._8_4_ = 0x3d2dbdcf;
        auVar285._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar285._12_4_ = 0x3d2dbdcf;
        auVar285._16_4_ = 0x3d2dbdcf;
        auVar285._20_4_ = 0x3d2dbdcf;
        auVar285._24_4_ = 0x3d2dbdcf;
        auVar285._28_4_ = 0x3d2dbdcf;
        auVar348._8_4_ = 0x3d3a73d8;
        auVar348._0_8_ = 0x3d3a73d83d3a73d8;
        auVar348._12_4_ = 0x3d3a73d8;
        auVar348._16_4_ = 0x3d3a73d8;
        auVar348._20_4_ = 0x3d3a73d8;
        auVar348._24_4_ = 0x3d3a73d8;
        auVar348._28_4_ = 0x3d3a73d8;
        auVar164 = vfmadd213ps_fma(auVar285,auVar104,auVar348);
        auVar349._8_4_ = 0x3e2aaaf8;
        auVar349._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar349._12_4_ = 0x3e2aaaf8;
        auVar349._16_4_ = 0x3e2aaaf8;
        auVar349._20_4_ = 0x3e2aaaf8;
        auVar349._24_4_ = 0x3e2aaaf8;
        auVar349._28_4_ = 0x3e2aaaf8;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar104,auVar349);
        auVar350._8_4_ = 0x3cc48f19;
        auVar350._0_8_ = 0x3cc48f193cc48f19;
        auVar350._12_4_ = 0x3cc48f19;
        auVar350._16_4_ = 0x3cc48f19;
        auVar350._20_4_ = 0x3cc48f19;
        auVar350._24_4_ = 0x3cc48f19;
        auVar350._28_4_ = 0x3cc48f19;
        auVar380._8_4_ = 0x3d997dcc;
        auVar380._0_8_ = 0x3d997dcc3d997dcc;
        auVar380._12_4_ = 0x3d997dcc;
        auVar380._16_4_ = 0x3d997dcc;
        auVar380._20_4_ = 0x3d997dcc;
        auVar380._24_4_ = 0x3d997dcc;
        auVar380._28_4_ = 0x3d997dcc;
        auVar127 = vfmadd213ps_fma(auVar350,auVar104,auVar380);
        auVar381._8_4_ = 0x3f800000;
        auVar381._0_8_ = 0x3f8000003f800000;
        auVar381._12_4_ = 0x3f800000;
        auVar381._16_4_ = 0x3f800000;
        auVar381._20_4_ = 0x3f800000;
        auVar381._24_4_ = 0x3f800000;
        auVar381._28_4_ = 0x3f800000;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar104,auVar381);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar7,ZEXT1632(auVar164));
        auVar104 = vandps_avx(auVar141,auVar381);
        auVar8._4_4_ = auVar164._4_4_ * fVar198;
        auVar8._0_4_ = auVar164._0_4_ * fVar28;
        auVar8._8_4_ = auVar164._8_4_ * fVar199;
        auVar8._12_4_ = auVar164._12_4_ * fVar200;
        auVar8._16_4_ = fVar201 * 0.0;
        auVar8._20_4_ = fVar202 * 0.0;
        auVar8._24_4_ = fVar203 * 0.0;
        auVar8._28_4_ = auVar44._28_4_;
        auVar189._8_4_ = 0xc0400000;
        auVar189._0_8_ = 0xc0400000c0400000;
        auVar189._12_4_ = 0xc0400000;
        auVar189._16_4_ = 0xc0400000;
        auVar189._20_4_ = 0xc0400000;
        auVar189._24_4_ = 0xc0400000;
        auVar189._28_4_ = 0xc0400000;
        auVar164 = vfmadd213ps_fma(auVar189,auVar104,auVar381);
        in_ZMM4 = ZEXT3264(CONCAT428(0x3fc90fdb,
                                     CONCAT424(0x3fc90fdb,
                                               CONCAT420(0x3fc90fdb,
                                                         CONCAT416(0x3fc90fdb,
                                                                   CONCAT412(0x3fc90fdb,
                                                                             CONCAT48(0x3fc90fdb,
                                                                                                                                                                            
                                                  0x3fc90fdb3fc90fdb)))))));
        auVar9._4_4_ = auVar104._4_4_ * 1.5707964;
        auVar9._0_4_ = auVar104._0_4_ * 1.5707964;
        auVar9._8_4_ = auVar104._8_4_ * 1.5707964;
        auVar9._12_4_ = auVar104._12_4_ * 1.5707964;
        auVar9._16_4_ = auVar104._16_4_ * 1.5707964;
        auVar9._20_4_ = auVar104._20_4_ * 1.5707964;
        auVar9._24_4_ = auVar104._24_4_ * 1.5707964;
        auVar9._28_4_ = auVar104._28_4_;
        auVar164 = vfmadd231ps_fma(auVar9,auVar8,ZEXT1632(auVar164));
        auVar100._8_4_ = 0x80000000;
        auVar100._0_8_ = 0x8000000080000000;
        auVar100._12_4_ = 0x80000000;
        auVar100._16_4_ = 0x80000000;
        auVar100._20_4_ = 0x80000000;
        auVar100._24_4_ = 0x80000000;
        auVar100._28_4_ = 0x80000000;
        auVar104 = vandps_avx(*pauVar26,auVar100);
        auVar104 = vorps_avx(auVar104,ZEXT1632(auVar164));
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar73._8_4_ = 0x7fffffff;
        auVar73._0_8_ = 0x7fffffff7fffffff;
        auVar73._12_4_ = 0x7fffffff;
        auVar164 = vandps_avx(*(undefined1 (*) [16])*pauVar26,auVar73);
        auVar157._8_4_ = 0x3f000000;
        auVar157._0_8_ = 0x3f0000003f000000;
        auVar157._12_4_ = 0x3f000000;
        auVar127 = vcmpps_avx(auVar157,auVar164,1);
        auVar118 = vfnmadd213ps_fma(auVar157,auVar164,auVar157);
        auVar118 = vsqrtps_avx(auVar118);
        auVar164 = vblendvps_avx(auVar164,auVar118,auVar127);
        fVar28 = auVar164._0_4_;
        auVar158._0_4_ = fVar28 * fVar28;
        fVar198 = auVar164._4_4_;
        auVar158._4_4_ = fVar198 * fVar198;
        fVar199 = auVar164._8_4_;
        auVar158._8_4_ = fVar199 * fVar199;
        fVar200 = auVar164._12_4_;
        auVar158._12_4_ = fVar200 * fVar200;
        auVar209._0_4_ = auVar158._0_4_ * auVar158._0_4_;
        auVar209._4_4_ = auVar158._4_4_ * auVar158._4_4_;
        auVar209._8_4_ = auVar158._8_4_ * auVar158._8_4_;
        auVar209._12_4_ = auVar158._12_4_ * auVar158._12_4_;
        auVar252._8_4_ = 0x3d2dbdcf;
        auVar252._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar252._12_4_ = 0x3d2dbdcf;
        auVar329._8_4_ = 0x3d3a73d8;
        auVar329._0_8_ = 0x3d3a73d83d3a73d8;
        auVar329._12_4_ = 0x3d3a73d8;
        auVar164 = vfmadd213ps_fma(auVar252,auVar209,auVar329);
        auVar330._8_4_ = 0x3e2aaaf8;
        auVar330._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar330._12_4_ = 0x3e2aaaf8;
        auVar164 = vfmadd213ps_fma(auVar164,auVar209,auVar330);
        auVar331._8_4_ = 0x3cc48f19;
        auVar331._0_8_ = 0x3cc48f193cc48f19;
        auVar331._12_4_ = 0x3cc48f19;
        auVar366._8_4_ = 0x3d997dcc;
        auVar366._0_8_ = 0x3d997dcc3d997dcc;
        auVar366._12_4_ = 0x3d997dcc;
        auVar118 = vfmadd213ps_fma(auVar331,auVar209,auVar366);
        auVar367._8_4_ = 0x3f800000;
        auVar367._0_8_ = 0x3f8000003f800000;
        auVar367._12_4_ = 0x3f800000;
        auVar118 = vfmadd213ps_fma(auVar118,auVar209,auVar367);
        auVar118 = vfmadd231ps_fma(auVar118,auVar158,auVar164);
        auVar164 = vandps_avx(auVar127,auVar367);
        auVar74._0_4_ = auVar118._0_4_ * fVar28;
        auVar74._4_4_ = auVar118._4_4_ * fVar198;
        auVar74._8_4_ = auVar118._8_4_ * fVar199;
        auVar74._12_4_ = auVar118._12_4_ * fVar200;
        auVar159._8_4_ = 0xc0400000;
        auVar159._0_8_ = 0xc0400000c0400000;
        auVar159._12_4_ = 0xc0400000;
        auVar127 = vfmadd213ps_fma(auVar159,auVar164,auVar367);
        in_ZMM4 = ZEXT1664(CONCAT412(0x3fc90fdb,CONCAT48(0x3fc90fdb,0x3fc90fdb3fc90fdb)));
        auVar120._0_4_ = auVar164._0_4_ * 1.5707964;
        auVar120._4_4_ = auVar164._4_4_ * 1.5707964;
        auVar120._8_4_ = auVar164._8_4_ * 1.5707964;
        auVar120._12_4_ = auVar164._12_4_ * 1.5707964;
        auVar127 = vfmadd231ps_fma(auVar120,auVar74,auVar127);
        auVar75._8_4_ = 0x80000000;
        auVar75._0_8_ = 0x8000000080000000;
        auVar75._12_4_ = 0x80000000;
        auVar164 = vandps_avx(*(undefined1 (*) [16])*pauVar26,auVar75);
        auVar164 = vorps_avx(auVar164,auVar127);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        fVar28 = asinf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 0xd:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = *pauVar26;
        auVar106._8_4_ = 0x7fffffff;
        auVar106._0_8_ = 0x7fffffff7fffffff;
        auVar106._12_4_ = 0x7fffffff;
        auVar106._16_4_ = 0x7fffffff;
        auVar106._20_4_ = 0x7fffffff;
        auVar106._24_4_ = 0x7fffffff;
        auVar106._28_4_ = 0x7fffffff;
        auVar44 = vandps_avx(auVar104,auVar106);
        auVar194._8_4_ = 0x3f000000;
        auVar194._0_8_ = 0x3f0000003f000000;
        auVar194._12_4_ = 0x3f000000;
        auVar194._16_4_ = 0x3f000000;
        auVar194._20_4_ = 0x3f000000;
        auVar194._24_4_ = 0x3f000000;
        auVar194._28_4_ = 0x3f000000;
        auVar164 = vfnmadd213ps_fma(auVar194,auVar44,auVar194);
        auVar192 = vsqrtps_avx(ZEXT1632(auVar164));
        auVar105 = vcmpps_avx(auVar194,auVar44,1);
        auVar141 = vblendvps_avx(auVar44,auVar192,auVar105);
        fVar28 = auVar141._0_4_;
        fVar112 = fVar28 * fVar28;
        fVar198 = auVar141._4_4_;
        fVar146 = fVar198 * fVar198;
        auVar13._4_4_ = fVar146;
        auVar13._0_4_ = fVar112;
        fVar199 = auVar141._8_4_;
        fVar147 = fVar199 * fVar199;
        auVar13._8_4_ = fVar147;
        fVar200 = auVar141._12_4_;
        fVar148 = fVar200 * fVar200;
        auVar13._12_4_ = fVar148;
        fVar201 = auVar141._16_4_;
        fVar149 = fVar201 * fVar201;
        auVar13._16_4_ = fVar149;
        fVar202 = auVar141._20_4_;
        fVar150 = fVar202 * fVar202;
        auVar13._20_4_ = fVar150;
        fVar203 = auVar141._24_4_;
        fVar151 = fVar203 * fVar203;
        auVar13._24_4_ = fVar151;
        auVar13._28_4_ = auVar192._28_4_;
        auVar395._0_4_ = fVar112 * fVar112;
        auVar395._4_4_ = fVar146 * fVar146;
        auVar395._8_4_ = fVar147 * fVar147;
        auVar395._12_4_ = fVar148 * fVar148;
        auVar395._16_4_ = fVar149 * fVar149;
        auVar395._20_4_ = fVar150 * fVar150;
        auVar395._28_36_ = in_ZMM4._28_36_;
        auVar395._24_4_ = fVar151 * fVar151;
        auVar44 = auVar395._0_32_;
        auVar303._8_4_ = 0x3d2dbdcf;
        auVar303._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar303._12_4_ = 0x3d2dbdcf;
        auVar303._16_4_ = 0x3d2dbdcf;
        auVar303._20_4_ = 0x3d2dbdcf;
        auVar303._24_4_ = 0x3d2dbdcf;
        auVar303._28_4_ = 0x3d2dbdcf;
        auVar356._8_4_ = 0x3d3a73d8;
        auVar356._0_8_ = 0x3d3a73d83d3a73d8;
        auVar356._12_4_ = 0x3d3a73d8;
        auVar356._16_4_ = 0x3d3a73d8;
        auVar356._20_4_ = 0x3d3a73d8;
        auVar356._24_4_ = 0x3d3a73d8;
        auVar356._28_4_ = 0x3d3a73d8;
        auVar164 = vfmadd213ps_fma(auVar303,auVar44,auVar356);
        auVar357._8_4_ = 0x3e2aaaf8;
        auVar357._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar357._12_4_ = 0x3e2aaaf8;
        auVar357._16_4_ = 0x3e2aaaf8;
        auVar357._20_4_ = 0x3e2aaaf8;
        auVar357._24_4_ = 0x3e2aaaf8;
        auVar357._28_4_ = 0x3e2aaaf8;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar44,auVar357);
        auVar358._8_4_ = 0x3cc48f19;
        auVar358._0_8_ = 0x3cc48f193cc48f19;
        auVar358._12_4_ = 0x3cc48f19;
        auVar358._16_4_ = 0x3cc48f19;
        auVar358._20_4_ = 0x3cc48f19;
        auVar358._24_4_ = 0x3cc48f19;
        auVar358._28_4_ = 0x3cc48f19;
        auVar382._8_4_ = 0x3d997dcc;
        auVar382._0_8_ = 0x3d997dcc3d997dcc;
        auVar382._12_4_ = 0x3d997dcc;
        auVar382._16_4_ = 0x3d997dcc;
        auVar382._20_4_ = 0x3d997dcc;
        auVar382._24_4_ = 0x3d997dcc;
        auVar382._28_4_ = 0x3d997dcc;
        auVar127 = vfmadd213ps_fma(auVar358,auVar44,auVar382);
        auVar383._8_4_ = 0x3f800000;
        auVar383._0_8_ = 0x3f8000003f800000;
        auVar383._12_4_ = 0x3f800000;
        auVar383._16_4_ = 0x3f800000;
        auVar383._20_4_ = 0x3f800000;
        auVar383._24_4_ = 0x3f800000;
        auVar383._28_4_ = 0x3f800000;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar383);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar13,ZEXT1632(auVar164));
        auVar142._8_4_ = 0x80000000;
        auVar142._0_8_ = 0x8000000080000000;
        auVar142._12_4_ = 0x80000000;
        auVar142._16_4_ = 0x80000000;
        auVar142._20_4_ = 0x80000000;
        auVar142._24_4_ = 0x80000000;
        auVar142._28_4_ = 0x80000000;
        auVar44 = vandps_avx(auVar104,auVar142);
        fVar28 = auVar164._0_4_ * fVar28;
        fVar198 = auVar164._4_4_ * fVar198;
        auVar14._4_4_ = fVar198;
        auVar14._0_4_ = fVar28;
        fVar199 = auVar164._8_4_ * fVar199;
        auVar14._8_4_ = fVar199;
        fVar200 = auVar164._12_4_ * fVar200;
        auVar14._12_4_ = fVar200;
        fVar201 = fVar201 * 0.0;
        auVar14._16_4_ = fVar201;
        fVar202 = fVar202 * 0.0;
        auVar14._20_4_ = fVar202;
        fVar112 = auVar141._28_4_;
        fVar203 = fVar203 * 0.0;
        auVar14._24_4_ = fVar203;
        auVar14._28_4_ = fVar112;
        auVar141 = vorps_avx(auVar44,auVar14);
        in_ZMM4 = ZEXT3264(auVar141);
        auVar107._0_4_ = fVar28 + fVar28;
        auVar107._4_4_ = fVar198 + fVar198;
        auVar107._8_4_ = fVar199 + fVar199;
        auVar107._12_4_ = fVar200 + fVar200;
        auVar107._16_4_ = fVar201 + fVar201;
        auVar107._20_4_ = fVar202 + fVar202;
        auVar107._24_4_ = fVar203 + fVar203;
        auVar107._28_4_ = fVar112 + fVar112;
        auVar44 = vorps_avx(auVar44,auVar107);
        auVar104 = vcmpps_avx(auVar104,_DAT_0053be40,1);
        auVar143._8_4_ = 0x40490fdb;
        auVar143._0_8_ = 0x40490fdb40490fdb;
        auVar143._12_4_ = 0x40490fdb;
        auVar143._16_4_ = 0x40490fdb;
        auVar143._20_4_ = 0x40490fdb;
        auVar143._24_4_ = 0x40490fdb;
        auVar143._28_4_ = 0x40490fdb;
        auVar104 = vandps_avx(auVar104,auVar143);
        auVar58._0_4_ = auVar104._0_4_ + auVar44._0_4_;
        auVar58._4_4_ = auVar104._4_4_ + auVar44._4_4_;
        auVar58._8_4_ = auVar104._8_4_ + auVar44._8_4_;
        auVar58._12_4_ = auVar104._12_4_ + auVar44._12_4_;
        auVar58._16_4_ = auVar104._16_4_ + auVar44._16_4_;
        auVar58._20_4_ = auVar104._20_4_ + auVar44._20_4_;
        auVar58._24_4_ = auVar104._24_4_ + auVar44._24_4_;
        auVar58._28_4_ = auVar104._28_4_ + auVar44._28_4_;
        auVar108._8_4_ = 0x3fc90fdb;
        auVar108._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar108._12_4_ = 0x3fc90fdb;
        auVar108._16_4_ = 0x3fc90fdb;
        auVar108._20_4_ = 0x3fc90fdb;
        auVar108._24_4_ = 0x3fc90fdb;
        auVar108._28_4_ = 0x3fc90fdb;
        auVar104 = vsubps_avx(auVar108,auVar141);
        auVar104 = vblendvps_avx(auVar104,auVar58,auVar105);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar164 = *(undefined1 (*) [16])*pauVar26;
        auVar82._8_4_ = 0x7fffffff;
        auVar82._0_8_ = 0x7fffffff7fffffff;
        auVar82._12_4_ = 0x7fffffff;
        auVar127 = vandps_avx(auVar164,auVar82);
        auVar169._8_4_ = 0x3f000000;
        auVar169._0_8_ = 0x3f0000003f000000;
        auVar169._12_4_ = 0x3f000000;
        auVar118 = vcmpps_avx(auVar169,auVar127,1);
        auVar64 = vfnmadd213ps_fma(auVar169,auVar127,auVar169);
        auVar64 = vsqrtps_avx(auVar64);
        auVar127 = vblendvps_avx(auVar127,auVar64,auVar118);
        fVar28 = auVar127._0_4_;
        auVar170._0_4_ = fVar28 * fVar28;
        fVar198 = auVar127._4_4_;
        auVar170._4_4_ = fVar198 * fVar198;
        fVar199 = auVar127._8_4_;
        auVar170._8_4_ = fVar199 * fVar199;
        fVar200 = auVar127._12_4_;
        auVar170._12_4_ = fVar200 * fVar200;
        auVar220._0_4_ = auVar170._0_4_ * auVar170._0_4_;
        auVar220._4_4_ = auVar170._4_4_ * auVar170._4_4_;
        auVar220._8_4_ = auVar170._8_4_ * auVar170._8_4_;
        auVar220._12_4_ = auVar170._12_4_ * auVar170._12_4_;
        auVar270._8_4_ = 0x3d2dbdcf;
        auVar270._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar270._12_4_ = 0x3d2dbdcf;
        auVar335._8_4_ = 0x3d3a73d8;
        auVar335._0_8_ = 0x3d3a73d83d3a73d8;
        auVar335._12_4_ = 0x3d3a73d8;
        auVar127 = vfmadd213ps_fma(auVar270,auVar220,auVar335);
        auVar336._8_4_ = 0x3e2aaaf8;
        auVar336._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar336._12_4_ = 0x3e2aaaf8;
        auVar127 = vfmadd213ps_fma(auVar127,auVar220,auVar336);
        auVar337._8_4_ = 0x3cc48f19;
        auVar337._0_8_ = 0x3cc48f193cc48f19;
        auVar337._12_4_ = 0x3cc48f19;
        auVar368._8_4_ = 0x3d997dcc;
        auVar368._0_8_ = 0x3d997dcc3d997dcc;
        auVar368._12_4_ = 0x3d997dcc;
        auVar64 = vfmadd213ps_fma(auVar337,auVar220,auVar368);
        auVar369._8_4_ = 0x3f800000;
        auVar369._0_8_ = 0x3f8000003f800000;
        auVar369._12_4_ = 0x3f800000;
        auVar64 = vfmadd213ps_fma(auVar64,auVar220,auVar369);
        auVar64 = vfmadd231ps_fma(auVar64,auVar170,auVar127);
        auVar171._8_4_ = 0x80000000;
        auVar171._0_8_ = 0x8000000080000000;
        auVar171._12_4_ = 0x80000000;
        auVar127 = vandps_avx(auVar164,auVar171);
        auVar83._0_4_ = auVar64._0_4_ * fVar28;
        auVar83._4_4_ = auVar64._4_4_ * fVar198;
        auVar83._8_4_ = auVar64._8_4_ * fVar199;
        auVar83._12_4_ = auVar64._12_4_ * fVar200;
        auVar64 = vorps_avx(auVar127,auVar83);
        in_ZMM4 = ZEXT1664(auVar64);
        auVar84._0_4_ = auVar83._0_4_ + auVar83._0_4_;
        auVar84._4_4_ = auVar83._4_4_ + auVar83._4_4_;
        auVar84._8_4_ = auVar83._8_4_ + auVar83._8_4_;
        auVar84._12_4_ = auVar83._12_4_ + auVar83._12_4_;
        auVar127 = vorps_avx(auVar127,auVar84);
        auVar164 = vcmpps_avx(auVar164,_DAT_00538060,1);
        auVar172._8_4_ = 0x40490fdb;
        auVar172._0_8_ = 0x40490fdb40490fdb;
        auVar172._12_4_ = 0x40490fdb;
        auVar164 = vandps_avx(auVar164,auVar172);
        auVar40._0_4_ = auVar164._0_4_ + auVar127._0_4_;
        auVar40._4_4_ = auVar164._4_4_ + auVar127._4_4_;
        auVar40._8_4_ = auVar164._8_4_ + auVar127._8_4_;
        auVar40._12_4_ = auVar164._12_4_ + auVar127._12_4_;
        auVar85._8_4_ = 0x3fc90fdb;
        auVar85._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar85._12_4_ = 0x3fc90fdb;
        auVar164 = vsubps_avx(auVar85,auVar64);
        auVar164 = vblendvps_avx(auVar164,auVar40,auVar118);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        fVar28 = acosf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 0xe:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar94._8_4_ = 0x7fffffff;
        auVar94._0_8_ = 0x7fffffff7fffffff;
        auVar94._12_4_ = 0x7fffffff;
        auVar94._16_4_ = 0x7fffffff;
        auVar94._20_4_ = 0x7fffffff;
        auVar94._24_4_ = 0x7fffffff;
        auVar94._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(*pauVar26,auVar94);
        auVar374._8_4_ = 0x3f800000;
        auVar374._0_8_ = 0x3f8000003f800000;
        auVar374._12_4_ = 0x3f800000;
        auVar374._16_4_ = 0x3f800000;
        auVar374._20_4_ = 0x3f800000;
        auVar374._24_4_ = 0x3f800000;
        auVar374._28_4_ = 0x3f800000;
        auVar141 = vcmpps_avx(auVar374,auVar104,1);
        auVar185._8_4_ = 0xbf800000;
        auVar185._0_8_ = 0xbf800000bf800000;
        auVar185._12_4_ = 0xbf800000;
        auVar185._16_4_ = 0xbf800000;
        auVar185._20_4_ = 0xbf800000;
        auVar185._24_4_ = 0xbf800000;
        auVar185._28_4_ = 0xbf800000;
        auVar44 = vblendvps_avx(auVar104,auVar185,auVar141);
        auVar104 = vmaxps_avx(auVar104,auVar374);
        auVar105 = vdivps_avx(auVar44,auVar104);
        fVar28 = auVar105._0_4_ * auVar105._0_4_;
        fVar198 = auVar105._4_4_ * auVar105._4_4_;
        auVar5._4_4_ = fVar198;
        auVar5._0_4_ = fVar28;
        fVar199 = auVar105._8_4_ * auVar105._8_4_;
        auVar5._8_4_ = fVar199;
        fVar200 = auVar105._12_4_ * auVar105._12_4_;
        auVar5._12_4_ = fVar200;
        fVar201 = auVar105._16_4_ * auVar105._16_4_;
        auVar5._16_4_ = fVar201;
        fVar202 = auVar105._20_4_ * auVar105._20_4_;
        auVar5._20_4_ = fVar202;
        fVar203 = auVar105._24_4_ * auVar105._24_4_;
        auVar5._24_4_ = fVar203;
        auVar5._28_4_ = auVar44._28_4_;
        auVar392._0_4_ = fVar28 * fVar28;
        auVar392._4_4_ = fVar198 * fVar198;
        auVar392._8_4_ = fVar199 * fVar199;
        auVar392._12_4_ = fVar200 * fVar200;
        auVar392._16_4_ = fVar201 * fVar201;
        auVar392._20_4_ = fVar202 * fVar202;
        auVar392._28_36_ = in_ZMM4._28_36_;
        auVar392._24_4_ = fVar203 * fVar203;
        auVar104 = auVar392._0_32_;
        in_ZMM4 = ZEXT3264(auVar104);
        auVar284._8_4_ = 0xbc83a25c;
        auVar284._0_8_ = 0xbc83a25cbc83a25c;
        auVar284._12_4_ = 0xbc83a25c;
        auVar284._16_4_ = 0xbc83a25c;
        auVar284._20_4_ = 0xbc83a25c;
        auVar284._24_4_ = 0xbc83a25c;
        auVar284._28_4_ = 0xbc83a25c;
        auVar340._8_4_ = 0xbd99b01e;
        auVar340._0_8_ = 0xbd99b01ebd99b01e;
        auVar340._12_4_ = 0xbd99b01e;
        auVar340._16_4_ = 0xbd99b01e;
        auVar340._20_4_ = 0xbd99b01e;
        auVar340._24_4_ = 0xbd99b01e;
        auVar340._28_4_ = 0xbd99b01e;
        auVar164 = vfmadd213ps_fma(auVar284,auVar104,auVar340);
        auVar341._8_4_ = 0xbe117200;
        auVar341._0_8_ = 0xbe117200be117200;
        auVar341._12_4_ = 0xbe117200;
        auVar341._16_4_ = 0xbe117200;
        auVar341._20_4_ = 0xbe117200;
        auVar341._24_4_ = 0xbe117200;
        auVar341._28_4_ = 0xbe117200;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar104,auVar341);
        auVar342._8_4_ = 0xbeaaaa53;
        auVar342._0_8_ = 0xbeaaaa53beaaaa53;
        auVar342._12_4_ = 0xbeaaaa53;
        auVar342._16_4_ = 0xbeaaaa53;
        auVar342._20_4_ = 0xbeaaaa53;
        auVar342._24_4_ = 0xbeaaaa53;
        auVar342._28_4_ = 0xbeaaaa53;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar104,auVar342);
        auVar343._8_4_ = 0x3b3ac537;
        auVar343._0_8_ = 0x3b3ac5373b3ac537;
        auVar343._12_4_ = 0x3b3ac537;
        auVar343._16_4_ = 0x3b3ac537;
        auVar343._20_4_ = 0x3b3ac537;
        auVar343._24_4_ = 0x3b3ac537;
        auVar343._28_4_ = 0x3b3ac537;
        auVar387._8_4_ = 0x3d2edd4e;
        auVar387._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar387._12_4_ = 0x3d2edd4e;
        auVar387._16_4_ = 0x3d2edd4e;
        auVar387._20_4_ = 0x3d2edd4e;
        auVar387._24_4_ = 0x3d2edd4e;
        auVar387._28_4_ = 0x3d2edd4e;
        auVar127 = vfmadd213ps_fma(auVar343,auVar104,auVar387);
        auVar388._8_4_ = 0x3dd9ed24;
        auVar388._0_8_ = 0x3dd9ed243dd9ed24;
        auVar388._12_4_ = 0x3dd9ed24;
        auVar388._16_4_ = 0x3dd9ed24;
        auVar388._20_4_ = 0x3dd9ed24;
        auVar388._24_4_ = 0x3dd9ed24;
        auVar388._28_4_ = 0x3dd9ed24;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar104,auVar388);
        auVar389._8_4_ = 0x3e4cb974;
        auVar389._0_8_ = 0x3e4cb9743e4cb974;
        auVar389._12_4_ = 0x3e4cb974;
        auVar389._16_4_ = 0x3e4cb974;
        auVar389._20_4_ = 0x3e4cb974;
        auVar389._24_4_ = 0x3e4cb974;
        auVar389._28_4_ = 0x3e4cb974;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar104,auVar389);
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar104,auVar374);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar5,ZEXT1632(auVar164));
        auVar186._8_4_ = 0x3fc90fdb;
        auVar186._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar186._12_4_ = 0x3fc90fdb;
        auVar186._16_4_ = 0x3fc90fdb;
        auVar186._20_4_ = 0x3fc90fdb;
        auVar186._24_4_ = 0x3fc90fdb;
        auVar186._28_4_ = 0x3fc90fdb;
        auVar104 = vandps_avx(auVar141,auVar186);
        auVar164 = vfmadd231ps_fma(auVar104,auVar105,ZEXT1632(auVar164));
        auVar95._8_4_ = 0x80000000;
        auVar95._0_8_ = 0x8000000080000000;
        auVar95._12_4_ = 0x80000000;
        auVar95._16_4_ = 0x80000000;
        auVar95._20_4_ = 0x80000000;
        auVar95._24_4_ = 0x80000000;
        auVar95._28_4_ = 0x80000000;
        auVar104 = vandps_avx(*pauVar26,auVar95);
        auVar104 = vorps_avx(auVar104,ZEXT1632(auVar164));
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar164 = vandps_avx(*(undefined1 (*) [16])*pauVar26,auVar69);
        auVar362._8_4_ = 0x3f800000;
        auVar362._0_8_ = 0x3f8000003f800000;
        auVar362._12_4_ = 0x3f800000;
        auVar118 = vcmpps_avx(auVar362,auVar164,1);
        auVar153._8_4_ = 0xbf800000;
        auVar153._0_8_ = 0xbf800000bf800000;
        auVar153._12_4_ = 0xbf800000;
        auVar127 = vblendvps_avx(auVar164,auVar153,auVar118);
        auVar164 = vmaxps_avx(auVar164,auVar362);
        auVar127 = vdivps_avx(auVar127,auVar164);
        auVar154._0_4_ = auVar127._0_4_ * auVar127._0_4_;
        auVar154._4_4_ = auVar127._4_4_ * auVar127._4_4_;
        auVar154._8_4_ = auVar127._8_4_ * auVar127._8_4_;
        auVar154._12_4_ = auVar127._12_4_ * auVar127._12_4_;
        auVar205._0_4_ = auVar154._0_4_ * auVar154._0_4_;
        auVar205._4_4_ = auVar154._4_4_ * auVar154._4_4_;
        auVar205._8_4_ = auVar154._8_4_ * auVar154._8_4_;
        auVar205._12_4_ = auVar154._12_4_ * auVar154._12_4_;
        in_ZMM4 = ZEXT1664(auVar205);
        auVar244._8_4_ = 0xbc83a25c;
        auVar244._0_8_ = 0xbc83a25cbc83a25c;
        auVar244._12_4_ = 0xbc83a25c;
        auVar320._8_4_ = 0xbd99b01e;
        auVar320._0_8_ = 0xbd99b01ebd99b01e;
        auVar320._12_4_ = 0xbd99b01e;
        auVar164 = vfmadd213ps_fma(auVar244,auVar205,auVar320);
        auVar321._8_4_ = 0xbe117200;
        auVar321._0_8_ = 0xbe117200be117200;
        auVar321._12_4_ = 0xbe117200;
        auVar164 = vfmadd213ps_fma(auVar164,auVar205,auVar321);
        auVar322._8_4_ = 0xbeaaaa53;
        auVar322._0_8_ = 0xbeaaaa53beaaaa53;
        auVar322._12_4_ = 0xbeaaaa53;
        auVar164 = vfmadd213ps_fma(auVar164,auVar205,auVar322);
        auVar323._8_4_ = 0x3b3ac537;
        auVar323._0_8_ = 0x3b3ac5373b3ac537;
        auVar323._12_4_ = 0x3b3ac537;
        auVar384._8_4_ = 0x3d2edd4e;
        auVar384._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar384._12_4_ = 0x3d2edd4e;
        auVar64 = vfmadd213ps_fma(auVar323,auVar205,auVar384);
        auVar385._8_4_ = 0x3dd9ed24;
        auVar385._0_8_ = 0x3dd9ed243dd9ed24;
        auVar385._12_4_ = 0x3dd9ed24;
        auVar64 = vfmadd213ps_fma(auVar64,auVar205,auVar385);
        auVar386._8_4_ = 0x3e4cb974;
        auVar386._0_8_ = 0x3e4cb9743e4cb974;
        auVar386._12_4_ = 0x3e4cb974;
        auVar64 = vfmadd213ps_fma(auVar64,auVar205,auVar386);
        auVar64 = vfmadd213ps_fma(auVar64,auVar205,auVar362);
        auVar64 = vfmadd231ps_fma(auVar64,auVar154,auVar164);
        auVar155._8_4_ = 0x3fc90fdb;
        auVar155._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar155._12_4_ = 0x3fc90fdb;
        auVar164 = vandps_avx(auVar118,auVar155);
        auVar127 = vfmadd231ps_fma(auVar164,auVar127,auVar64);
        auVar70._8_4_ = 0x80000000;
        auVar70._0_8_ = 0x8000000080000000;
        auVar70._12_4_ = 0x80000000;
        auVar164 = vandps_avx(*(undefined1 (*) [16])*pauVar26,auVar70);
        auVar164 = vorps_avx(auVar164,auVar127);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        fVar28 = atanf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 0xf:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    auVar54._16_4_ = 0x3f800000;
    auVar54._20_4_ = 0x3f800000;
    auVar54._24_4_ = 0x3f800000;
    auVar54._28_4_ = 0x3f800000;
    auVar79._8_4_ = 0x3f800000;
    auVar79._0_8_ = 0x3f8000003f800000;
    auVar79._12_4_ = 0x3f800000;
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = vdivps_avx(auVar54,*pauVar26);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar164 = vdivps_avx(auVar79,*(undefined1 (*) [16])*pauVar26);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) =
             1.0 / *(float *)((long)pvVar1 + lVar23 * 4 + lVar24);
      }
    }
    break;
  case 0x10:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    auVar392 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; auVar164 = auVar392._0_16_, iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar228._8_4_ = 0xc0000000;
        auVar228._0_8_ = 0xc0000000c0000000;
        auVar228._12_4_ = 0xc0000000;
        auVar228._16_4_ = 0xc0000000;
        auVar228._20_4_ = 0xc0000000;
        auVar228._24_4_ = 0xc0000000;
        auVar228._28_4_ = 0xc0000000;
        auVar396._0_4_ = *(float *)*pauVar26 * -2.0;
        auVar396._4_4_ = *(float *)((long)*pauVar26 + 4) * -2.0;
        auVar396._8_4_ = *(float *)((long)*pauVar26 + 8) * -2.0;
        auVar396._12_4_ = *(float *)((long)*pauVar26 + 0xc) * -2.0;
        auVar396._16_4_ = *(float *)((long)*pauVar26 + 0x10) * -2.0;
        auVar396._20_4_ = *(float *)((long)*pauVar26 + 0x14) * -2.0;
        auVar396._28_36_ = in_ZMM0._28_36_;
        auVar396._24_4_ = *(float *)((long)*pauVar26 + 0x18) * -2.0;
        auVar90._8_4_ = 0x42b0c0a5;
        auVar90._0_8_ = 0x42b0c0a542b0c0a5;
        auVar90._12_4_ = 0x42b0c0a5;
        auVar90._16_4_ = 0x42b0c0a5;
        auVar90._20_4_ = 0x42b0c0a5;
        auVar90._24_4_ = 0x42b0c0a5;
        auVar90._28_4_ = 0x42b0c0a5;
        auVar104 = vminps_avx(auVar396._0_32_,auVar90);
        auVar91._8_4_ = 0xc2b0c0a5;
        auVar91._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar91._12_4_ = 0xc2b0c0a5;
        auVar91._16_4_ = 0xc2b0c0a5;
        auVar91._20_4_ = 0xc2b0c0a5;
        auVar91._24_4_ = 0xc2b0c0a5;
        auVar91._28_4_ = 0xc2b0c0a5;
        auVar44 = vmaxps_avx(auVar104,auVar91);
        auVar92._8_4_ = 0x3fb8aa3b;
        auVar92._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar92._12_4_ = 0x3fb8aa3b;
        auVar92._16_4_ = 0x3fb8aa3b;
        auVar92._20_4_ = 0x3fb8aa3b;
        auVar92._24_4_ = 0x3fb8aa3b;
        auVar92._28_4_ = 0x3fb8aa3b;
        auVar283._8_4_ = 0x3f000000;
        auVar283._0_8_ = 0x3f0000003f000000;
        auVar283._12_4_ = 0x3f000000;
        auVar283._16_4_ = 0x3f000000;
        auVar283._20_4_ = 0x3f000000;
        auVar283._24_4_ = 0x3f000000;
        auVar283._28_4_ = 0x3f000000;
        auVar127 = vfmadd213ps_fma(auVar92,auVar44,auVar283);
        auVar141 = vroundps_avx(ZEXT1632(auVar127),1);
        auVar104 = vcmpps_avx(ZEXT1632(auVar127),auVar141,1);
        auVar339._8_4_ = 0x3f800000;
        auVar339._0_8_ = 0x3f8000003f800000;
        auVar339._12_4_ = 0x3f800000;
        auVar339._16_4_ = 0x3f800000;
        auVar339._20_4_ = 0x3f800000;
        auVar339._24_4_ = 0x3f800000;
        auVar339._28_4_ = 0x3f800000;
        auVar104 = vandps_avx(auVar104,auVar339);
        auVar104 = vsubps_avx(auVar141,auVar104);
        auVar131._8_4_ = 0x3f318000;
        auVar131._0_8_ = 0x3f3180003f318000;
        auVar131._12_4_ = 0x3f318000;
        auVar131._16_4_ = 0x3f318000;
        auVar131._20_4_ = 0x3f318000;
        auVar131._24_4_ = 0x3f318000;
        auVar131._28_4_ = 0x3f318000;
        auVar127 = vfmsub231ps_fma(auVar44,auVar104,auVar131);
        auVar132._8_4_ = 0x395e8083;
        auVar132._0_8_ = 0x395e8083395e8083;
        auVar132._12_4_ = 0x395e8083;
        auVar132._16_4_ = 0x395e8083;
        auVar132._20_4_ = 0x395e8083;
        auVar132._24_4_ = 0x395e8083;
        auVar132._28_4_ = 0x395e8083;
        auVar118 = vfmsub231ps_fma(ZEXT1632(auVar127),auVar104,auVar132);
        auVar44 = ZEXT1632(auVar118);
        auVar4._28_4_ = 0x395e8083;
        auVar4._0_28_ =
             ZEXT1628(CONCAT412(auVar118._12_4_ * auVar118._12_4_,
                                CONCAT48(auVar118._8_4_ * auVar118._8_4_,
                                         CONCAT44(auVar118._4_4_ * auVar118._4_4_,
                                                  auVar118._0_4_ * auVar118._0_4_))));
        auVar184._8_4_ = 0x39506967;
        auVar184._0_8_ = 0x3950696739506967;
        auVar184._12_4_ = 0x39506967;
        auVar184._16_4_ = 0x39506967;
        auVar184._20_4_ = 0x39506967;
        auVar184._24_4_ = 0x39506967;
        auVar184._28_4_ = 0x39506967;
        auVar370._8_4_ = 0x3ab743ce;
        auVar370._0_8_ = 0x3ab743ce3ab743ce;
        auVar370._12_4_ = 0x3ab743ce;
        auVar370._16_4_ = 0x3ab743ce;
        auVar370._20_4_ = 0x3ab743ce;
        auVar370._24_4_ = 0x3ab743ce;
        auVar370._28_4_ = 0x3ab743ce;
        auVar127 = vfmadd213ps_fma(auVar184,auVar44,auVar370);
        auVar371._8_4_ = 0x3c088908;
        auVar371._0_8_ = 0x3c0889083c088908;
        auVar371._12_4_ = 0x3c088908;
        auVar371._16_4_ = 0x3c088908;
        auVar371._20_4_ = 0x3c088908;
        auVar371._24_4_ = 0x3c088908;
        auVar371._28_4_ = 0x3c088908;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar371);
        auVar372._8_4_ = 0x3d2aa9c1;
        auVar372._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar372._12_4_ = 0x3d2aa9c1;
        auVar372._16_4_ = 0x3d2aa9c1;
        auVar372._20_4_ = 0x3d2aa9c1;
        auVar372._24_4_ = 0x3d2aa9c1;
        auVar372._28_4_ = 0x3d2aa9c1;
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar372);
        auVar373._8_4_ = 0x3e2aaaaa;
        auVar373._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar373._12_4_ = 0x3e2aaaaa;
        auVar373._16_4_ = 0x3e2aaaaa;
        auVar373._20_4_ = 0x3e2aaaaa;
        auVar373._24_4_ = 0x3e2aaaaa;
        auVar373._28_4_ = 0x3e2aaaaa;
        auVar44 = ZEXT1632(auVar118);
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar373);
        auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar44,auVar283);
        auVar118 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar4,auVar44);
        auVar29._0_4_ = (int)auVar104._0_4_;
        auVar29._4_4_ = (int)auVar104._4_4_;
        auVar29._8_4_ = (int)auVar104._8_4_;
        auVar29._12_4_ = (int)auVar104._12_4_;
        auVar45._16_4_ = (int)auVar104._16_4_;
        auVar45._0_16_ = auVar29;
        auVar45._20_4_ = (int)auVar104._20_4_;
        auVar45._24_4_ = (int)auVar104._24_4_;
        auVar45._28_4_ = (int)auVar104._28_4_;
        auVar64 = vpslld_avx(auVar29,0x17);
        auVar127 = vpslld_avx(auVar45._16_16_,0x17);
        auVar127 = vpaddd_avx(auVar164,auVar127);
        auVar164 = vpaddd_avx(auVar164,auVar64);
        auVar46._16_16_ = auVar127;
        auVar46._0_16_ = auVar164;
        auVar93._0_4_ = auVar118._0_4_ + 1.0;
        auVar93._4_4_ = auVar118._4_4_ + 1.0;
        auVar93._8_4_ = auVar118._8_4_ + 1.0;
        auVar93._12_4_ = auVar118._12_4_ + 1.0;
        auVar93._16_4_ = 0x3f800000;
        auVar93._20_4_ = 0x3f800000;
        auVar93._24_4_ = 0x3f800000;
        auVar93._28_4_ = 0x3f800000;
        auVar164 = vfmadd213ps_fma(auVar46,auVar93,auVar339);
        auVar104 = vdivps_avx(auVar339,ZEXT1632(auVar164));
        auVar164 = vfnmsub213ps_fma(auVar104,auVar228,auVar339);
        in_ZMM0 = ZEXT1664(auVar164);
        *pauVar26 = ZEXT1632(auVar164);
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar30._0_4_ = *(float *)*pauVar26 * -2.0;
        auVar30._4_4_ = *(float *)((long)*pauVar26 + 4) * -2.0;
        auVar30._8_4_ = *(float *)((long)*pauVar26 + 8) * -2.0;
        auVar30._12_4_ = *(float *)((long)*pauVar26 + 0xc) * -2.0;
        auVar65._8_4_ = 0x42b0c0a5;
        auVar65._0_8_ = 0x42b0c0a542b0c0a5;
        auVar65._12_4_ = 0x42b0c0a5;
        auVar127 = vminps_avx(auVar30,auVar65);
        auVar66._8_4_ = 0xc2b0c0a5;
        auVar66._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar66._12_4_ = 0xc2b0c0a5;
        auVar64 = vmaxps_avx(auVar127,auVar66);
        auVar67._8_4_ = 0x3fb8aa3b;
        auVar67._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar67._12_4_ = 0x3fb8aa3b;
        auVar204._8_4_ = 0x3f000000;
        auVar204._0_8_ = 0x3f0000003f000000;
        auVar204._12_4_ = 0x3f000000;
        auVar127 = vfmadd213ps_fma(auVar67,auVar64,auVar204);
        auVar113._0_4_ = (int)auVar127._0_4_;
        auVar113._4_4_ = (int)auVar127._4_4_;
        auVar113._8_4_ = (int)auVar127._8_4_;
        auVar113._12_4_ = (int)auVar127._12_4_;
        auVar118 = vcvtdq2ps_avx(auVar113);
        auVar127 = vcmpps_avx(auVar127,auVar118,1);
        auVar127 = vandps_avx(auVar164,auVar127);
        auVar127 = vsubps_avx(auVar118,auVar127);
        auVar114._8_4_ = 0x3f318000;
        auVar114._0_8_ = 0x3f3180003f318000;
        auVar114._12_4_ = 0x3f318000;
        auVar118 = vfmsub231ps_fma(auVar64,auVar127,auVar114);
        auVar115._8_4_ = 0x395e8083;
        auVar115._0_8_ = 0x395e8083395e8083;
        auVar115._12_4_ = 0x395e8083;
        auVar64 = vfmsub231ps_fma(auVar118,auVar127,auVar115);
        auVar116._0_4_ = auVar64._0_4_ * auVar64._0_4_;
        auVar116._4_4_ = auVar64._4_4_ * auVar64._4_4_;
        auVar116._8_4_ = auVar64._8_4_ * auVar64._8_4_;
        auVar116._12_4_ = auVar64._12_4_ * auVar64._12_4_;
        auVar152._8_4_ = 0x39506967;
        auVar152._0_8_ = 0x3950696739506967;
        auVar152._12_4_ = 0x39506967;
        auVar240._8_4_ = 0x3ab743ce;
        auVar240._0_8_ = 0x3ab743ce3ab743ce;
        auVar240._12_4_ = 0x3ab743ce;
        auVar118 = vfmadd213ps_fma(auVar152,auVar64,auVar240);
        auVar241._8_4_ = 0x3c088908;
        auVar241._0_8_ = 0x3c0889083c088908;
        auVar241._12_4_ = 0x3c088908;
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar241);
        auVar242._8_4_ = 0x3d2aa9c1;
        auVar242._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar242._12_4_ = 0x3d2aa9c1;
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar242);
        auVar243._8_4_ = 0x3e2aaaaa;
        auVar243._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar243._12_4_ = 0x3e2aaaaa;
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar243);
        auVar118 = vfmadd213ps_fma(auVar118,auVar64,auVar204);
        auVar118 = vfmadd213ps_fma(auVar118,auVar116,auVar64);
        auVar31._0_4_ = auVar392._0_4_ + auVar118._0_4_;
        auVar31._4_4_ = auVar392._4_4_ + auVar118._4_4_;
        auVar31._8_4_ = auVar392._8_4_ + auVar118._8_4_;
        auVar31._12_4_ = auVar392._12_4_ + auVar118._12_4_;
        auVar68._0_4_ = (int)auVar127._0_4_;
        auVar68._4_4_ = (int)auVar127._4_4_;
        auVar68._8_4_ = (int)auVar127._8_4_;
        auVar68._12_4_ = (int)auVar127._12_4_;
        auVar127 = vpslld_avx(auVar68,0x17);
        auVar127 = vpaddd_avx(auVar164,auVar127);
        auVar127 = vfmadd213ps_fma(auVar127,auVar31,auVar164);
        auVar32._8_4_ = 0x40000000;
        auVar32._0_8_ = 0x4000000040000000;
        auVar32._12_4_ = 0x40000000;
        auVar127 = vdivps_avx(auVar32,auVar127);
        auVar33._0_4_ = auVar127._0_4_ + -1.0;
        auVar33._4_4_ = auVar127._4_4_ + -1.0;
        auVar33._8_4_ = auVar127._8_4_ + -1.0;
        auVar33._12_4_ = auVar127._12_4_ + -1.0;
        in_ZMM0 = ZEXT1664(auVar33);
        *(undefined1 (*) [16])*pauVar26 = auVar33;
        pauVar26 = (undefined1 (*) [32])((long)*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        in_ZMM0._0_4_ = tanhf(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        in_ZMM0._4_60_ = extraout_var;
        auVar392 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = in_ZMM0._0_4_;
      }
    }
    break;
  case 0x11:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104._8_4_ = 0x800000;
        auVar104._0_8_ = 0x80000000800000;
        auVar104._12_4_ = 0x800000;
        auVar104._16_4_ = 0x800000;
        auVar104._20_4_ = 0x800000;
        auVar104._24_4_ = 0x800000;
        auVar104._28_4_ = 0x800000;
        auVar104 = vmaxps_avx(*pauVar26,auVar104);
        auVar127 = vpsrld_avx(auVar104._0_16_,0x17);
        auVar164 = vpsrld_avx(auVar104._16_16_,0x17);
        auVar231._8_4_ = 0x807fffff;
        auVar231._0_8_ = 0x807fffff807fffff;
        auVar231._12_4_ = 0x807fffff;
        auVar231._16_4_ = 0x807fffff;
        auVar231._20_4_ = 0x807fffff;
        auVar231._24_4_ = 0x807fffff;
        auVar231._28_4_ = 0x807fffff;
        auVar104 = vandps_avx(auVar104,auVar231);
        auVar355._8_4_ = 0x3f000000;
        auVar355._0_8_ = 0x3f0000003f000000;
        auVar355._12_4_ = 0x3f000000;
        auVar355._16_4_ = 0x3f000000;
        auVar355._20_4_ = 0x3f000000;
        auVar355._24_4_ = 0x3f000000;
        auVar355._28_4_ = 0x3f000000;
        auVar141 = vorps_avx(auVar104,auVar355);
        auVar232._8_4_ = 0x3f3504f3;
        auVar232._0_8_ = 0x3f3504f33f3504f3;
        auVar232._12_4_ = 0x3f3504f3;
        auVar232._16_4_ = 0x3f3504f3;
        auVar232._20_4_ = 0x3f3504f3;
        auVar232._24_4_ = 0x3f3504f3;
        auVar232._28_4_ = 0x3f3504f3;
        auVar44 = vcmpps_avx(auVar232,auVar141,2);
        auVar104 = vandnps_avx(auVar44,auVar141);
        auVar105._0_4_ = auVar141._0_4_ + -1.0 + auVar104._0_4_;
        auVar105._4_4_ = auVar141._4_4_ + -1.0 + auVar104._4_4_;
        auVar105._8_4_ = auVar141._8_4_ + -1.0 + auVar104._8_4_;
        auVar105._12_4_ = auVar141._12_4_ + -1.0 + auVar104._12_4_;
        auVar105._16_4_ = auVar141._16_4_ + -1.0 + auVar104._16_4_;
        auVar105._20_4_ = auVar141._20_4_ + -1.0 + auVar104._20_4_;
        auVar105._24_4_ = auVar141._24_4_ + -1.0 + auVar104._24_4_;
        auVar105._28_4_ = auVar141._28_4_ + -1.0 + auVar104._28_4_;
        auVar164 = vpsubd_avx(auVar164,auVar44._16_16_);
        auVar118._8_4_ = 0xffffff81;
        auVar118._0_8_ = 0xffffff81ffffff81;
        auVar118._12_4_ = 0xffffff81;
        auVar164 = vpaddd_avx(auVar164,auVar118);
        auVar127 = vpsubd_avx(auVar127,auVar44._0_16_);
        auVar127 = vpaddd_avx(auVar127,auVar118);
        auVar141._16_16_ = auVar164;
        auVar141._0_16_ = auVar127;
        auVar192._0_4_ = auVar105._0_4_ * auVar105._0_4_;
        auVar192._4_4_ = auVar105._4_4_ * auVar105._4_4_;
        auVar192._8_4_ = auVar105._8_4_ * auVar105._8_4_;
        auVar192._12_4_ = auVar105._12_4_ * auVar105._12_4_;
        auVar192._16_4_ = auVar105._16_4_ * auVar105._16_4_;
        auVar192._20_4_ = auVar105._20_4_ * auVar105._20_4_;
        auVar192._24_4_ = auVar105._24_4_ * auVar105._24_4_;
        auVar192._28_4_ = 0;
        auVar233._8_4_ = 0x3d9021bb;
        auVar233._0_8_ = 0x3d9021bb3d9021bb;
        auVar233._12_4_ = 0x3d9021bb;
        auVar233._16_4_ = 0x3d9021bb;
        auVar233._20_4_ = 0x3d9021bb;
        auVar233._24_4_ = 0x3d9021bb;
        auVar233._28_4_ = 0x3d9021bb;
        auVar294._8_4_ = 0xbdebd1b8;
        auVar294._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar294._12_4_ = 0xbdebd1b8;
        auVar294._16_4_ = 0xbdebd1b8;
        auVar294._20_4_ = 0xbdebd1b8;
        auVar294._24_4_ = 0xbdebd1b8;
        auVar294._28_4_ = 0xbdebd1b8;
        auVar164 = vfmadd213ps_fma(auVar233,auVar105,auVar294);
        auVar295._8_4_ = 0x3def251a;
        auVar295._0_8_ = 0x3def251a3def251a;
        auVar295._12_4_ = 0x3def251a;
        auVar295._16_4_ = 0x3def251a;
        auVar295._20_4_ = 0x3def251a;
        auVar295._24_4_ = 0x3def251a;
        auVar295._28_4_ = 0x3def251a;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar105,auVar295);
        auVar296._8_4_ = 0xbdfe5d4f;
        auVar296._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar296._12_4_ = 0xbdfe5d4f;
        auVar296._16_4_ = 0xbdfe5d4f;
        auVar296._20_4_ = 0xbdfe5d4f;
        auVar296._24_4_ = 0xbdfe5d4f;
        auVar296._28_4_ = 0xbdfe5d4f;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar105,auVar296);
        auVar297._8_4_ = 0x3e11e9bf;
        auVar297._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar297._12_4_ = 0x3e11e9bf;
        auVar297._16_4_ = 0x3e11e9bf;
        auVar297._20_4_ = 0x3e11e9bf;
        auVar297._24_4_ = 0x3e11e9bf;
        auVar297._28_4_ = 0x3e11e9bf;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar105,auVar297);
        auVar298._8_4_ = 0xbe2aae50;
        auVar298._0_8_ = 0xbe2aae50be2aae50;
        auVar298._12_4_ = 0xbe2aae50;
        auVar298._16_4_ = 0xbe2aae50;
        auVar298._20_4_ = 0xbe2aae50;
        auVar298._24_4_ = 0xbe2aae50;
        auVar298._28_4_ = 0xbe2aae50;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar105,auVar298);
        auVar299._8_4_ = 0x3e4cceac;
        auVar299._0_8_ = 0x3e4cceac3e4cceac;
        auVar299._12_4_ = 0x3e4cceac;
        auVar299._16_4_ = 0x3e4cceac;
        auVar299._20_4_ = 0x3e4cceac;
        auVar299._24_4_ = 0x3e4cceac;
        auVar299._28_4_ = 0x3e4cceac;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar105,auVar299);
        auVar300._8_4_ = 0xbe7ffffc;
        auVar300._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar300._12_4_ = 0xbe7ffffc;
        auVar300._16_4_ = 0xbe7ffffc;
        auVar300._20_4_ = 0xbe7ffffc;
        auVar300._24_4_ = 0xbe7ffffc;
        auVar300._28_4_ = 0xbe7ffffc;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar105,auVar300);
        auVar301._8_4_ = 0x3eaaaaaa;
        auVar301._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar301._12_4_ = 0x3eaaaaaa;
        auVar301._16_4_ = 0x3eaaaaaa;
        auVar301._20_4_ = 0x3eaaaaaa;
        auVar301._24_4_ = 0x3eaaaaaa;
        auVar301._28_4_ = 0x3eaaaaaa;
        auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar105,auVar301);
        auVar234._0_4_ = auVar192._0_4_ * auVar105._0_4_ * auVar164._0_4_;
        auVar234._4_4_ = auVar192._4_4_ * auVar105._4_4_ * auVar164._4_4_;
        auVar234._8_4_ = auVar192._8_4_ * auVar105._8_4_ * auVar164._8_4_;
        auVar234._12_4_ = auVar192._12_4_ * auVar105._12_4_ * auVar164._12_4_;
        auVar234._16_4_ = auVar192._16_4_ * auVar105._16_4_ * 0.0;
        auVar234._20_4_ = auVar192._20_4_ * auVar105._20_4_ * 0.0;
        auVar234._24_4_ = auVar192._24_4_ * auVar105._24_4_ * 0.0;
        auVar234._28_4_ = 0;
        auVar104 = vcvtdq2ps_avx(auVar141);
        auVar302._8_4_ = 0xb95e8083;
        auVar302._0_8_ = 0xb95e8083b95e8083;
        auVar302._12_4_ = 0xb95e8083;
        auVar302._16_4_ = 0xb95e8083;
        auVar302._20_4_ = 0xb95e8083;
        auVar302._24_4_ = 0xb95e8083;
        auVar302._28_4_ = 0xb95e8083;
        auVar164 = vfmadd231ps_fma(auVar234,auVar104,auVar302);
        auVar164 = vfmsub231ps_fma(ZEXT1632(auVar164),auVar355,auVar192);
        auVar44 = vsubps_avx(ZEXT1632(auVar164),auVar105);
        auVar193._8_4_ = 0x3f318000;
        auVar193._0_8_ = 0x3f3180003f318000;
        auVar193._12_4_ = 0x3f318000;
        auVar193._16_4_ = 0x3f318000;
        auVar193._20_4_ = 0x3f318000;
        auVar193._24_4_ = 0x3f318000;
        auVar193._28_4_ = 0x3f318000;
        auVar164 = vfnmadd231ps_fma(auVar44,auVar193,auVar104);
        auVar104 = vcmpps_avx(*pauVar26,_DAT_0053be40,2);
        auVar44._0_4_ = auVar164._0_4_ * -0.4342945;
        auVar44._4_4_ = auVar164._4_4_ * -0.4342945;
        auVar44._8_4_ = auVar164._8_4_ * -0.4342945;
        auVar44._12_4_ = auVar164._12_4_ * -0.4342945;
        auVar44._16_4_ = 0x80000000;
        auVar44._20_4_ = 0x80000000;
        auVar44._24_4_ = 0x80000000;
        auVar44._28_4_ = 0;
        auVar104 = vorps_avx(auVar104,auVar44);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar164._8_4_ = 0x800000;
        auVar164._0_8_ = 0x80000000800000;
        auVar164._12_4_ = 0x800000;
        auVar164 = vmaxps_avx(*(undefined1 (*) [16])*pauVar26,auVar164);
        auVar127 = vpsrld_avx(auVar164,0x17);
        auVar165._8_4_ = 0xffffff82;
        auVar165._0_8_ = 0xffffff82ffffff82;
        auVar165._12_4_ = 0xffffff82;
        auVar127 = vpaddd_avx(auVar127,auVar165);
        auVar166._8_4_ = 0x807fffff;
        auVar166._0_8_ = 0x807fffff807fffff;
        auVar166._12_4_ = 0x807fffff;
        auVar164 = vandps_avx(auVar164,auVar166);
        auVar334._8_4_ = 0x3f000000;
        auVar334._0_8_ = 0x3f0000003f000000;
        auVar334._12_4_ = 0x3f000000;
        auVar64 = vorps_avx(auVar164,auVar334);
        auVar118 = vcvtdq2ps_avx(auVar127);
        auVar127._8_4_ = 0x3f3504f3;
        auVar127._0_8_ = 0x3f3504f33f3504f3;
        auVar127._12_4_ = 0x3f3504f3;
        auVar127 = vcmpps_avx(auVar64,auVar127,1);
        auVar164 = vandps_avx(auVar127,auVar64);
        auVar363._0_4_ = auVar64._0_4_ + -1.0 + auVar164._0_4_;
        auVar363._4_4_ = auVar64._4_4_ + -1.0 + auVar164._4_4_;
        auVar363._8_4_ = auVar64._8_4_ + -1.0 + auVar164._8_4_;
        auVar363._12_4_ = auVar64._12_4_ + -1.0 + auVar164._12_4_;
        auVar217._8_4_ = 0x3f800000;
        auVar217._0_8_ = 0x3f8000003f800000;
        auVar217._12_4_ = 0x3f800000;
        auVar164 = vandps_avx(auVar127,auVar217);
        auVar164 = vsubps_avx(auVar118,auVar164);
        auVar167._0_4_ = auVar363._0_4_ * auVar363._0_4_;
        auVar167._4_4_ = auVar363._4_4_ * auVar363._4_4_;
        auVar167._8_4_ = auVar363._8_4_ * auVar363._8_4_;
        auVar167._12_4_ = auVar363._12_4_ * auVar363._12_4_;
        auVar218._8_4_ = 0x3d9021bb;
        auVar218._0_8_ = 0x3d9021bb3d9021bb;
        auVar218._12_4_ = 0x3d9021bb;
        auVar261._8_4_ = 0xbdebd1b8;
        auVar261._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar261._12_4_ = 0xbdebd1b8;
        auVar127 = vfmadd213ps_fma(auVar218,auVar363,auVar261);
        auVar262._8_4_ = 0x3def251a;
        auVar262._0_8_ = 0x3def251a3def251a;
        auVar262._12_4_ = 0x3def251a;
        auVar127 = vfmadd213ps_fma(auVar127,auVar363,auVar262);
        auVar263._8_4_ = 0xbdfe5d4f;
        auVar263._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar263._12_4_ = 0xbdfe5d4f;
        auVar127 = vfmadd213ps_fma(auVar127,auVar363,auVar263);
        auVar264._8_4_ = 0x3e11e9bf;
        auVar264._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar264._12_4_ = 0x3e11e9bf;
        auVar127 = vfmadd213ps_fma(auVar127,auVar363,auVar264);
        auVar265._8_4_ = 0xbe2aae50;
        auVar265._0_8_ = 0xbe2aae50be2aae50;
        auVar265._12_4_ = 0xbe2aae50;
        auVar127 = vfmadd213ps_fma(auVar127,auVar363,auVar265);
        auVar266._8_4_ = 0x3e4cceac;
        auVar266._0_8_ = 0x3e4cceac3e4cceac;
        auVar266._12_4_ = 0x3e4cceac;
        auVar127 = vfmadd213ps_fma(auVar127,auVar363,auVar266);
        auVar267._8_4_ = 0xbe7ffffc;
        auVar267._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar267._12_4_ = 0xbe7ffffc;
        auVar127 = vfmadd213ps_fma(auVar127,auVar363,auVar267);
        auVar268._8_4_ = 0x3eaaaaaa;
        auVar268._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar268._12_4_ = 0x3eaaaaaa;
        auVar127 = vfmadd213ps_fma(auVar127,auVar363,auVar268);
        auVar219._0_4_ = auVar167._0_4_ * auVar363._0_4_ * auVar127._0_4_;
        auVar219._4_4_ = auVar167._4_4_ * auVar363._4_4_ * auVar127._4_4_;
        auVar219._8_4_ = auVar167._8_4_ * auVar363._8_4_ * auVar127._8_4_;
        auVar219._12_4_ = auVar167._12_4_ * auVar363._12_4_ * auVar127._12_4_;
        auVar269._8_4_ = 0xb95e8083;
        auVar269._0_8_ = 0xb95e8083b95e8083;
        auVar269._12_4_ = 0xb95e8083;
        auVar127 = vfmadd231ps_fma(auVar219,auVar164,auVar269);
        auVar127 = vfmsub231ps_fma(auVar127,auVar334,auVar167);
        auVar127 = vsubps_avx(auVar127,auVar363);
        auVar168._8_4_ = 0x3f318000;
        auVar168._0_8_ = 0x3f3180003f318000;
        auVar168._12_4_ = 0x3f318000;
        auVar127 = vfnmadd231ps_fma(auVar127,auVar168,auVar164);
        auVar164 = vcmpps_avx(*(undefined1 (*) [16])*pauVar26,_DAT_00538060,2);
        auVar64._0_4_ = auVar127._0_4_ * -0.4342945;
        auVar64._4_4_ = auVar127._4_4_ * -0.4342945;
        auVar64._8_4_ = auVar127._8_4_ * -0.4342945;
        auVar64._12_4_ = auVar127._12_4_ * -0.4342945;
        auVar164 = vorps_avx(auVar164,auVar64);
        *(undefined1 (*) [16])*pauVar26 = auVar164;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        fVar28 = log10f(*(float *)((long)pvVar1 + lVar23 * 4 + lVar24));
        *(float *)((long)pvVar1 + lVar23 * 4 + lVar24) = fVar28;
      }
    }
    break;
  case 0x12:
    iVar20 = fegetround();
    uVar22 = 0;
    fesetround(0);
    iVar27 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar25 = 0; iVar25 + 7 < iVar27; iVar25 = iVar25 + 8) {
        auVar104 = vroundps_avx(*pauVar26,8);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar25 + 3 < iVar27; iVar25 = iVar25 + 4) {
        auVar127 = vroundps_avx(*(undefined1 (*) [16])*pauVar26,8);
        *(undefined1 (*) [16])*pauVar26 = auVar127;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar27; lVar23 = lVar23 + 1) {
        auVar127 = vroundss_avx(auVar164,ZEXT416(*(uint *)((long)pvVar1 + lVar23 * 4 + lVar24)),0xc)
        ;
        *(int *)((long)pvVar1 + lVar23 * 4 + lVar24) = auVar127._0_4_;
      }
    }
    fesetround(iVar20);
    break;
  case 0x13:
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar26 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar23 = 0;
      for (iVar27 = 0; iVar27 + 7 < iVar20; iVar27 = iVar27 + 8) {
        auVar104 = vroundps_avx(*pauVar26,0xb);
        *pauVar26 = auVar104;
        pauVar26 = pauVar26 + 1;
        lVar23 = lVar23 + 8;
      }
      for (; iVar27 + 3 < iVar20; iVar27 = iVar27 + 4) {
        auVar127 = vroundps_avx(*(undefined1 (*) [16])*pauVar26,0xb);
        *(undefined1 (*) [16])*pauVar26 = auVar127;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        lVar23 = lVar23 + 4;
      }
      lVar24 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar23 < iVar20; lVar23 = lVar23 + 1) {
        auVar127 = vroundss_avx(auVar164,ZEXT416(*(uint *)((long)pvVar1 + lVar23 * 4 + lVar24)),0xb)
        ;
        *(int *)((long)pvVar1 + lVar23 * 4 + lVar24) = auVar127._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}